

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  bool bVar66;
  bool bVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  ulong uVar71;
  long lVar72;
  uint uVar73;
  long lVar75;
  ulong uVar76;
  undefined1 auVar77 [8];
  float fVar78;
  float fVar103;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar105;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar79;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar106;
  float fVar133;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar135;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar136;
  float fVar161;
  float fVar162;
  vint4 bi;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar163;
  float fVar187;
  float fVar188;
  vint4 ai_1;
  undefined1 auVar164 [16];
  float fVar189;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar190;
  float fVar211;
  float fVar212;
  vint4 ai_2;
  undefined1 auVar191 [16];
  float fVar213;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar214;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar215;
  float fVar234;
  float fVar235;
  undefined1 auVar216 [16];
  float fVar236;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar242 [16];
  undefined1 auVar247 [32];
  vint4 ai;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar284;
  float fVar296;
  float fVar297;
  undefined1 auVar285 [16];
  float fVar298;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  float fVar307;
  float fVar308;
  float fVar315;
  float fVar317;
  undefined1 auVar309 [16];
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar325;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar333;
  undefined1 auVar330 [32];
  float fVar340;
  float fVar341;
  vfloat4 a0;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar342;
  undefined1 auVar343 [16];
  float fVar351;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar349;
  float fVar350;
  undefined1 auVar348 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_4d9;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  int local_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 auStack_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 auStack_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 auStack_398 [16];
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  ulong local_2d0;
  Precalculations *local_2c8;
  Primitive *local_2c0;
  RTCFilterFunctionNArguments local_2b8;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  uint auStack_268 [4];
  undefined8 local_258;
  undefined4 local_250;
  undefined8 local_24c;
  undefined4 local_244;
  uint local_240;
  uint local_23c;
  uint local_238;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [32];
  float afStack_178 [8];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar74;
  undefined1 auVar186 [32];
  undefined1 auVar347 [32];
  
  PVar11 = prim[1];
  uVar71 = (ulong)(byte)PVar11;
  lVar72 = uVar71 * 0x25;
  fVar79 = *(float *)(prim + lVar72 + 0x12);
  auVar122 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar248._0_4_ = fVar79 * (ray->dir).field_0.m128[0];
  auVar248._4_4_ = fVar79 * (ray->dir).field_0.m128[1];
  auVar248._8_4_ = fVar79 * (ray->dir).field_0.m128[2];
  auVar248._12_4_ = fVar79 * (ray->dir).field_0.m128[3];
  auVar137._0_4_ = fVar79 * auVar122._0_4_;
  auVar137._4_4_ = fVar79 * auVar122._4_4_;
  auVar137._8_4_ = fVar79 * auVar122._8_4_;
  auVar137._12_4_ = fVar79 * auVar122._12_4_;
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar171 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xf + 6)));
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar71 + 6)));
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1a + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1b + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1c + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar19 = vshufps_avx(auVar248,auVar248,0);
  auVar20 = vshufps_avx(auVar248,auVar248,0x55);
  auVar258 = vshufps_avx(auVar248,auVar248,0xaa);
  fVar79 = auVar258._0_4_;
  fVar136 = auVar258._4_4_;
  fVar161 = auVar258._8_4_;
  fVar162 = auVar258._12_4_;
  fVar190 = auVar20._0_4_;
  fVar211 = auVar20._4_4_;
  fVar212 = auVar20._8_4_;
  fVar213 = auVar20._12_4_;
  fVar163 = auVar19._0_4_;
  fVar187 = auVar19._4_4_;
  fVar188 = auVar19._8_4_;
  fVar189 = auVar19._12_4_;
  auVar321._0_4_ = fVar163 * auVar122._0_4_ + fVar190 * auVar171._0_4_ + fVar79 * auVar18._0_4_;
  auVar321._4_4_ = fVar187 * auVar122._4_4_ + fVar211 * auVar171._4_4_ + fVar136 * auVar18._4_4_;
  auVar321._8_4_ = fVar188 * auVar122._8_4_ + fVar212 * auVar171._8_4_ + fVar161 * auVar18._8_4_;
  auVar321._12_4_ = fVar189 * auVar122._12_4_ + fVar213 * auVar171._12_4_ + fVar162 * auVar18._12_4_
  ;
  auVar326._0_4_ = fVar163 * auVar232._0_4_ + fVar190 * auVar147._0_4_ + auVar121._0_4_ * fVar79;
  auVar326._4_4_ = fVar187 * auVar232._4_4_ + fVar211 * auVar147._4_4_ + auVar121._4_4_ * fVar136;
  auVar326._8_4_ = fVar188 * auVar232._8_4_ + fVar212 * auVar147._8_4_ + auVar121._8_4_ * fVar161;
  auVar326._12_4_ =
       fVar189 * auVar232._12_4_ + fVar213 * auVar147._12_4_ + auVar121._12_4_ * fVar162;
  auVar249._0_4_ = fVar163 * auVar179._0_4_ + fVar190 * auVar96._0_4_ + auVar151._0_4_ * fVar79;
  auVar249._4_4_ = fVar187 * auVar179._4_4_ + fVar211 * auVar96._4_4_ + auVar151._4_4_ * fVar136;
  auVar249._8_4_ = fVar188 * auVar179._8_4_ + fVar212 * auVar96._8_4_ + auVar151._8_4_ * fVar161;
  auVar249._12_4_ = fVar189 * auVar179._12_4_ + fVar213 * auVar96._12_4_ + auVar151._12_4_ * fVar162
  ;
  auVar19 = vshufps_avx(auVar137,auVar137,0);
  auVar20 = vshufps_avx(auVar137,auVar137,0x55);
  auVar258 = vshufps_avx(auVar137,auVar137,0xaa);
  fVar79 = auVar258._0_4_;
  fVar136 = auVar258._4_4_;
  fVar161 = auVar258._8_4_;
  fVar162 = auVar258._12_4_;
  fVar190 = auVar20._0_4_;
  fVar211 = auVar20._4_4_;
  fVar212 = auVar20._8_4_;
  fVar213 = auVar20._12_4_;
  fVar163 = auVar19._0_4_;
  fVar187 = auVar19._4_4_;
  fVar188 = auVar19._8_4_;
  fVar189 = auVar19._12_4_;
  auVar138._0_4_ = fVar163 * auVar122._0_4_ + fVar190 * auVar171._0_4_ + fVar79 * auVar18._0_4_;
  auVar138._4_4_ = fVar187 * auVar122._4_4_ + fVar211 * auVar171._4_4_ + fVar136 * auVar18._4_4_;
  auVar138._8_4_ = fVar188 * auVar122._8_4_ + fVar212 * auVar171._8_4_ + fVar161 * auVar18._8_4_;
  auVar138._12_4_ = fVar189 * auVar122._12_4_ + fVar213 * auVar171._12_4_ + fVar162 * auVar18._12_4_
  ;
  auVar107._0_4_ = fVar163 * auVar232._0_4_ + auVar121._0_4_ * fVar79 + fVar190 * auVar147._0_4_;
  auVar107._4_4_ = fVar187 * auVar232._4_4_ + auVar121._4_4_ * fVar136 + fVar211 * auVar147._4_4_;
  auVar107._8_4_ = fVar188 * auVar232._8_4_ + auVar121._8_4_ * fVar161 + fVar212 * auVar147._8_4_;
  auVar107._12_4_ =
       fVar189 * auVar232._12_4_ + auVar121._12_4_ * fVar162 + fVar213 * auVar147._12_4_;
  auVar80._0_4_ = fVar163 * auVar179._0_4_ + fVar190 * auVar96._0_4_ + auVar151._0_4_ * fVar79;
  auVar80._4_4_ = fVar187 * auVar179._4_4_ + fVar211 * auVar96._4_4_ + auVar151._4_4_ * fVar136;
  auVar80._8_4_ = fVar188 * auVar179._8_4_ + fVar212 * auVar96._8_4_ + auVar151._8_4_ * fVar161;
  auVar80._12_4_ = fVar189 * auVar179._12_4_ + fVar213 * auVar96._12_4_ + auVar151._12_4_ * fVar162;
  auVar237._8_4_ = 0x7fffffff;
  auVar237._0_8_ = 0x7fffffff7fffffff;
  auVar237._12_4_ = 0x7fffffff;
  auVar122 = vandps_avx(auVar321,auVar237);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar122 = vcmpps_avx(auVar122,auVar191,1);
  auVar171 = vblendvps_avx(auVar321,auVar191,auVar122);
  auVar122 = vandps_avx(auVar326,auVar237);
  auVar122 = vcmpps_avx(auVar122,auVar191,1);
  auVar18 = vblendvps_avx(auVar326,auVar191,auVar122);
  auVar122 = vandps_avx(auVar249,auVar237);
  auVar122 = vcmpps_avx(auVar122,auVar191,1);
  auVar122 = vblendvps_avx(auVar249,auVar191,auVar122);
  auVar232 = vrcpps_avx(auVar171);
  fVar163 = auVar232._0_4_;
  auVar164._0_4_ = fVar163 * auVar171._0_4_;
  fVar187 = auVar232._4_4_;
  auVar164._4_4_ = fVar187 * auVar171._4_4_;
  fVar188 = auVar232._8_4_;
  auVar164._8_4_ = fVar188 * auVar171._8_4_;
  fVar189 = auVar232._12_4_;
  auVar164._12_4_ = fVar189 * auVar171._12_4_;
  auVar250._8_4_ = 0x3f800000;
  auVar250._0_8_ = &DAT_3f8000003f800000;
  auVar250._12_4_ = 0x3f800000;
  auVar171 = vsubps_avx(auVar250,auVar164);
  fVar163 = fVar163 + fVar163 * auVar171._0_4_;
  fVar187 = fVar187 + fVar187 * auVar171._4_4_;
  fVar188 = fVar188 + fVar188 * auVar171._8_4_;
  fVar189 = fVar189 + fVar189 * auVar171._12_4_;
  auVar171 = vrcpps_avx(auVar18);
  fVar190 = auVar171._0_4_;
  auVar216._0_4_ = fVar190 * auVar18._0_4_;
  fVar211 = auVar171._4_4_;
  auVar216._4_4_ = fVar211 * auVar18._4_4_;
  fVar212 = auVar171._8_4_;
  auVar216._8_4_ = fVar212 * auVar18._8_4_;
  fVar213 = auVar171._12_4_;
  auVar216._12_4_ = fVar213 * auVar18._12_4_;
  auVar171 = vsubps_avx(auVar250,auVar216);
  fVar190 = fVar190 + fVar190 * auVar171._0_4_;
  fVar211 = fVar211 + fVar211 * auVar171._4_4_;
  fVar212 = fVar212 + fVar212 * auVar171._8_4_;
  fVar213 = fVar213 + fVar213 * auVar171._12_4_;
  auVar171 = vrcpps_avx(auVar122);
  fVar215 = auVar171._0_4_;
  auVar238._0_4_ = fVar215 * auVar122._0_4_;
  fVar234 = auVar171._4_4_;
  auVar238._4_4_ = fVar234 * auVar122._4_4_;
  fVar235 = auVar171._8_4_;
  auVar238._8_4_ = fVar235 * auVar122._8_4_;
  fVar236 = auVar171._12_4_;
  auVar238._12_4_ = fVar236 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar250,auVar238);
  fVar215 = fVar215 + fVar215 * auVar122._0_4_;
  fVar234 = fVar234 + fVar234 * auVar122._4_4_;
  fVar235 = fVar235 + fVar235 * auVar122._8_4_;
  fVar236 = fVar236 + fVar236 * auVar122._12_4_;
  auVar122 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar72 + 0x16)) *
                           *(float *)(prim + lVar72 + 0x1a)));
  auVar18 = vshufps_avx(auVar122,auVar122,0);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar122 = vpmovsxwd_avx(auVar122);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar171 = vpmovsxwd_avx(auVar171);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar122);
  fVar79 = auVar18._0_4_;
  fVar136 = auVar18._4_4_;
  fVar161 = auVar18._8_4_;
  fVar162 = auVar18._12_4_;
  auVar251._0_4_ = auVar171._0_4_ * fVar79 + auVar122._0_4_;
  auVar251._4_4_ = auVar171._4_4_ * fVar136 + auVar122._4_4_;
  auVar251._8_4_ = auVar171._8_4_ * fVar161 + auVar122._8_4_;
  auVar251._12_4_ = auVar171._12_4_ * fVar162 + auVar122._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar122 = vpmovsxwd_avx(auVar18);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar71 * 0xd + 6);
  auVar171 = vpmovsxwd_avx(auVar232);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar122);
  auVar263._0_4_ = auVar171._0_4_ * fVar79 + auVar122._0_4_;
  auVar263._4_4_ = auVar171._4_4_ * fVar136 + auVar122._4_4_;
  auVar263._8_4_ = auVar171._8_4_ * fVar161 + auVar122._8_4_;
  auVar263._12_4_ = auVar171._12_4_ * fVar162 + auVar122._12_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar71 * 0x12 + 6);
  auVar122 = vpmovsxwd_avx(auVar147);
  auVar122 = vcvtdq2ps_avx(auVar122);
  uVar76 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar71 * 2 + uVar76 + 6);
  auVar171 = vpmovsxwd_avx(auVar121);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar122);
  auVar285._0_4_ = auVar171._0_4_ * fVar79 + auVar122._0_4_;
  auVar285._4_4_ = auVar171._4_4_ * fVar136 + auVar122._4_4_;
  auVar285._8_4_ = auVar171._8_4_ * fVar161 + auVar122._8_4_;
  auVar285._12_4_ = auVar171._12_4_ * fVar162 + auVar122._12_4_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar122 = vpmovsxwd_avx(auVar179);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar71 * 0x18 + 6);
  auVar171 = vpmovsxwd_avx(auVar96);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar122);
  auVar299._0_4_ = auVar171._0_4_ * fVar79 + auVar122._0_4_;
  auVar299._4_4_ = auVar171._4_4_ * fVar136 + auVar122._4_4_;
  auVar299._8_4_ = auVar171._8_4_ * fVar161 + auVar122._8_4_;
  auVar299._12_4_ = auVar171._12_4_ * fVar162 + auVar122._12_4_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar71 * 0x1d + 6);
  auVar122 = vpmovsxwd_avx(auVar151);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar71 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar171 = vpmovsxwd_avx(auVar19);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar18 = vsubps_avx(auVar171,auVar122);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar71) + 6);
  auVar171 = vpmovsxwd_avx(auVar20);
  auVar309._0_4_ = auVar18._0_4_ * fVar79 + auVar122._0_4_;
  auVar309._4_4_ = auVar18._4_4_ * fVar136 + auVar122._4_4_;
  auVar309._8_4_ = auVar18._8_4_ * fVar161 + auVar122._8_4_;
  auVar309._12_4_ = auVar18._12_4_ * fVar162 + auVar122._12_4_;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + uVar71 * 0x23 + 6);
  auVar18 = vpmovsxwd_avx(auVar258);
  auVar122 = vcvtdq2ps_avx(auVar171);
  auVar171 = vcvtdq2ps_avx(auVar18);
  auVar171 = vsubps_avx(auVar171,auVar122);
  auVar239._0_4_ = auVar122._0_4_ + auVar171._0_4_ * fVar79;
  auVar239._4_4_ = auVar122._4_4_ + auVar171._4_4_ * fVar136;
  auVar239._8_4_ = auVar122._8_4_ + auVar171._8_4_ * fVar161;
  auVar239._12_4_ = auVar122._12_4_ + auVar171._12_4_ * fVar162;
  auVar122 = vsubps_avx(auVar251,auVar138);
  auVar252._0_4_ = fVar163 * auVar122._0_4_;
  auVar252._4_4_ = fVar187 * auVar122._4_4_;
  auVar252._8_4_ = fVar188 * auVar122._8_4_;
  auVar252._12_4_ = fVar189 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar263,auVar138);
  auVar139._0_4_ = fVar163 * auVar122._0_4_;
  auVar139._4_4_ = fVar187 * auVar122._4_4_;
  auVar139._8_4_ = fVar188 * auVar122._8_4_;
  auVar139._12_4_ = fVar189 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar285,auVar107);
  auVar165._0_4_ = fVar190 * auVar122._0_4_;
  auVar165._4_4_ = fVar211 * auVar122._4_4_;
  auVar165._8_4_ = fVar212 * auVar122._8_4_;
  auVar165._12_4_ = fVar213 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar299,auVar107);
  auVar108._0_4_ = fVar190 * auVar122._0_4_;
  auVar108._4_4_ = fVar211 * auVar122._4_4_;
  auVar108._8_4_ = fVar212 * auVar122._8_4_;
  auVar108._12_4_ = fVar213 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar309,auVar80);
  auVar192._0_4_ = fVar215 * auVar122._0_4_;
  auVar192._4_4_ = fVar234 * auVar122._4_4_;
  auVar192._8_4_ = fVar235 * auVar122._8_4_;
  auVar192._12_4_ = fVar236 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar239,auVar80);
  auVar81._0_4_ = fVar215 * auVar122._0_4_;
  auVar81._4_4_ = fVar234 * auVar122._4_4_;
  auVar81._8_4_ = fVar235 * auVar122._8_4_;
  auVar81._12_4_ = fVar236 * auVar122._12_4_;
  auVar122 = vpminsd_avx(auVar252,auVar139);
  auVar171 = vpminsd_avx(auVar165,auVar108);
  auVar122 = vmaxps_avx(auVar122,auVar171);
  auVar171 = vpminsd_avx(auVar192,auVar81);
  uVar8 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar264._4_4_ = uVar8;
  auVar264._0_4_ = uVar8;
  auVar264._8_4_ = uVar8;
  auVar264._12_4_ = uVar8;
  auVar171 = vmaxps_avx(auVar171,auVar264);
  auVar122 = vmaxps_avx(auVar122,auVar171);
  local_1e8._0_4_ = auVar122._0_4_ * 0.99999964;
  local_1e8._4_4_ = auVar122._4_4_ * 0.99999964;
  local_1e8._8_4_ = auVar122._8_4_ * 0.99999964;
  local_1e8._12_4_ = auVar122._12_4_ * 0.99999964;
  auVar122 = vpmaxsd_avx(auVar252,auVar139);
  auVar171 = vpmaxsd_avx(auVar165,auVar108);
  auVar122 = vminps_avx(auVar122,auVar171);
  auVar171 = vpmaxsd_avx(auVar192,auVar81);
  fVar79 = ray->tfar;
  auVar140._4_4_ = fVar79;
  auVar140._0_4_ = fVar79;
  auVar140._8_4_ = fVar79;
  auVar140._12_4_ = fVar79;
  auVar171 = vminps_avx(auVar171,auVar140);
  auVar122 = vminps_avx(auVar122,auVar171);
  auVar82._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar122._12_4_ * 1.0000004;
  auVar122 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar171 = vpcmpgtd_avx(auVar122,_DAT_01ff0cf0);
  auVar122 = vcmpps_avx(local_1e8,auVar82,2);
  auVar122 = vandps_avx(auVar122,auVar171);
  uVar68 = vmovmskps_avx(auVar122);
  local_4d9 = uVar68 != 0;
  if (uVar68 == 0) {
    return local_4d9;
  }
  auVar99._16_16_ = mm_lookupmask_ps._240_16_;
  auVar99._0_16_ = mm_lookupmask_ps._240_16_;
  uVar68 = uVar68 & 0xff;
  local_198 = vblendps_avx(auVar99,ZEXT832(0) << 0x20,0x80);
  auVar348 = ZEXT464(0) << 0x20;
  local_2c8 = pre;
  local_2c0 = prim;
LAB_00ff97f8:
  auVar77 = (undefined1  [8])(ulong)uVar68;
  lVar72 = 0;
  if (auVar77 != (undefined1  [8])0x0) {
    for (; (uVar68 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  uVar70 = *(uint *)(local_2c0 + 2);
  local_2d0 = (ulong)*(uint *)(local_2c0 + lVar72 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar70].ptr;
  fVar79 = (pGVar12->time_range).lower;
  fVar79 = pGVar12->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar79) / ((pGVar12->time_range).upper - fVar79));
  auVar122 = vroundss_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),9);
  auVar122 = vminss_avx(auVar122,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar122 = vmaxss_avx(ZEXT816(0) << 0x20,auVar122);
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_2d0 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar122._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + lVar75);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar75);
  pfVar3 = (float *)(lVar14 + lVar15 * uVar71);
  fVar136 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar163 = pfVar3[3];
  lVar72 = uVar71 + 1;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar72);
  lVar1 = uVar71 + 2;
  pfVar4 = (float *)(lVar14 + lVar15 * lVar1);
  lVar2 = uVar71 + 3;
  pfVar5 = (float *)(lVar14 + lVar15 * lVar2);
  fVar187 = *pfVar5;
  fVar188 = pfVar5[1];
  fVar189 = pfVar5[2];
  fVar190 = pfVar5[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar75);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar75);
  pfVar5 = (float *)(lVar15 + lVar16 * uVar71);
  fVar211 = *pfVar5;
  fVar212 = pfVar5[1];
  fVar213 = pfVar5[2];
  fVar215 = pfVar5[3];
  pfVar5 = (float *)(lVar15 + lVar16 * lVar72);
  pfVar6 = (float *)(lVar15 + lVar16 * lVar1);
  fVar79 = fVar79 - auVar122._0_4_;
  pfVar7 = (float *)(lVar15 + lVar16 * lVar2);
  fVar234 = *pfVar7;
  fVar235 = pfVar7[1];
  fVar236 = pfVar7[2];
  fVar214 = pfVar7[3];
  fVar308 = auVar348._8_4_;
  fVar316 = auVar348._12_4_;
  fVar284 = *pfVar4 * 0.0;
  fVar296 = pfVar4[1] * 0.0;
  fVar297 = fVar308 * pfVar4[2];
  fVar298 = fVar316 * pfVar4[3];
  fVar78 = fVar284 + fVar187 * 0.0;
  fVar103 = fVar296 + fVar188 * 0.0;
  fVar104 = fVar297 + fVar308 * fVar189;
  fVar105 = fVar298 + fVar316 * fVar190;
  fVar307 = *pfVar3 * 0.0;
  fVar315 = pfVar3[1] * 0.0;
  fVar317 = fVar308 * pfVar3[2];
  fVar319 = fVar316 * pfVar3[3];
  local_498._0_4_ = fVar136 + fVar307 + fVar78;
  local_498._4_4_ = fVar161 + fVar315 + fVar103;
  fStack_490 = fVar162 + fVar317 + fVar104;
  fStack_48c = fVar163 + fVar319 + fVar105;
  auVar83._0_4_ = *pfVar3 * 3.0 + fVar78;
  auVar83._4_4_ = pfVar3[1] * 3.0 + fVar103;
  auVar83._8_4_ = pfVar3[2] * 3.0 + fVar104;
  auVar83._12_4_ = pfVar3[3] * 3.0 + fVar105;
  auVar141._0_4_ = fVar136 * 3.0;
  auVar141._4_4_ = fVar161 * 3.0;
  auVar141._8_4_ = fVar162 * 3.0;
  auVar141._12_4_ = fVar163 * 3.0;
  auVar96 = vsubps_avx(auVar83,auVar141);
  fVar106 = *pfVar6 * 0.0;
  fVar133 = pfVar6[1] * 0.0;
  fVar134 = pfVar6[2] * fVar308;
  fVar135 = pfVar6[3] * fVar316;
  fVar78 = fVar106 + fVar234 * 0.0;
  fVar103 = fVar133 + fVar235 * 0.0;
  fVar104 = fVar134 + fVar236 * fVar308;
  fVar105 = fVar135 + fVar214 * fVar316;
  fVar325 = *pfVar5 * 0.0;
  fVar331 = pfVar5[1] * 0.0;
  fVar332 = fVar308 * pfVar5[2];
  fVar333 = fVar316 * pfVar5[3];
  auVar334._0_4_ = fVar325 + fVar78 + fVar211;
  auVar334._4_4_ = fVar331 + fVar103 + fVar212;
  auVar334._8_4_ = fVar332 + fVar104 + fVar213;
  auVar334._12_4_ = fVar333 + fVar105 + fVar215;
  auVar84._0_4_ = *pfVar5 * 3.0 + fVar78;
  auVar84._4_4_ = pfVar5[1] * 3.0 + fVar103;
  auVar84._8_4_ = pfVar5[2] * 3.0 + fVar104;
  auVar84._12_4_ = pfVar5[3] * 3.0 + fVar105;
  auVar240._0_4_ = fVar211 * 3.0;
  auVar240._4_4_ = fVar212 * 3.0;
  auVar240._8_4_ = fVar213 * 3.0;
  auVar240._12_4_ = fVar215 * 3.0;
  auVar232 = vsubps_avx(auVar84,auVar240);
  auVar166._0_4_ = fVar136 * 0.0;
  auVar166._4_4_ = fVar161 * 0.0;
  auVar166._8_4_ = fVar308 * fVar162;
  auVar166._12_4_ = fVar316 * fVar163;
  auVar241._0_4_ = auVar166._0_4_ + fVar307 + fVar284 + fVar187;
  auVar241._4_4_ = auVar166._4_4_ + fVar315 + fVar296 + fVar188;
  auVar241._8_4_ = auVar166._8_4_ + fVar317 + fVar297 + fVar189;
  auVar241._12_4_ = auVar166._12_4_ + fVar319 + fVar298 + fVar190;
  auVar253._0_4_ = fVar187 * 3.0;
  auVar253._4_4_ = fVar188 * 3.0;
  auVar253._8_4_ = fVar189 * 3.0;
  auVar253._12_4_ = fVar190 * 3.0;
  auVar193._0_4_ = *pfVar4 * 3.0;
  auVar193._4_4_ = pfVar4[1] * 3.0;
  auVar193._8_4_ = pfVar4[2] * 3.0;
  auVar193._12_4_ = pfVar4[3] * 3.0;
  auVar122 = vsubps_avx(auVar253,auVar193);
  auVar194._0_4_ = fVar307 + auVar122._0_4_;
  auVar194._4_4_ = fVar315 + auVar122._4_4_;
  auVar194._8_4_ = fVar317 + auVar122._8_4_;
  auVar194._12_4_ = fVar319 + auVar122._12_4_;
  auVar151 = vsubps_avx(auVar194,auVar166);
  auVar195._0_4_ = fVar211 * 0.0;
  auVar195._4_4_ = fVar212 * 0.0;
  auVar195._8_4_ = fVar308 * fVar213;
  auVar195._12_4_ = fVar316 * fVar215;
  auVar167._0_4_ = auVar195._0_4_ + fVar325 + fVar234 + fVar106;
  auVar167._4_4_ = auVar195._4_4_ + fVar331 + fVar235 + fVar133;
  auVar167._8_4_ = auVar195._8_4_ + fVar332 + fVar236 + fVar134;
  auVar167._12_4_ = auVar195._12_4_ + fVar333 + fVar214 + fVar135;
  auVar217._0_4_ = fVar234 * 3.0;
  auVar217._4_4_ = fVar235 * 3.0;
  auVar217._8_4_ = fVar236 * 3.0;
  auVar217._12_4_ = fVar214 * 3.0;
  auVar254._0_4_ = *pfVar6 * 3.0;
  auVar254._4_4_ = pfVar6[1] * 3.0;
  auVar254._8_4_ = pfVar6[2] * 3.0;
  auVar254._12_4_ = pfVar6[3] * 3.0;
  auVar122 = vsubps_avx(auVar217,auVar254);
  auVar218._0_4_ = fVar325 + auVar122._0_4_;
  auVar218._4_4_ = fVar331 + auVar122._4_4_;
  auVar218._8_4_ = fVar332 + auVar122._8_4_;
  auVar218._12_4_ = fVar333 + auVar122._12_4_;
  auVar121 = vsubps_avx(auVar218,auVar195);
  auVar122 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar171 = vshufps_avx(auVar334,auVar334,0xc9);
  fVar78 = auVar96._0_4_;
  auVar219._0_4_ = fVar78 * auVar171._0_4_;
  fVar103 = auVar96._4_4_;
  auVar219._4_4_ = fVar103 * auVar171._4_4_;
  fVar104 = auVar96._8_4_;
  auVar219._8_4_ = fVar104 * auVar171._8_4_;
  fVar105 = auVar96._12_4_;
  auVar219._12_4_ = fVar105 * auVar171._12_4_;
  auVar265._0_4_ = auVar334._0_4_ * auVar122._0_4_;
  auVar265._4_4_ = auVar334._4_4_ * auVar122._4_4_;
  auVar265._8_4_ = auVar334._8_4_ * auVar122._8_4_;
  auVar265._12_4_ = auVar334._12_4_ * auVar122._12_4_;
  auVar171 = vsubps_avx(auVar265,auVar219);
  auVar18 = vshufps_avx(auVar171,auVar171,0xc9);
  auVar171 = vshufps_avx(auVar232,auVar232,0xc9);
  auVar266._0_4_ = auVar171._0_4_ * fVar78;
  auVar266._4_4_ = auVar171._4_4_ * fVar103;
  auVar266._8_4_ = auVar171._8_4_ * fVar104;
  auVar266._12_4_ = auVar171._12_4_ * fVar105;
  auVar85._0_4_ = auVar122._0_4_ * auVar232._0_4_;
  auVar85._4_4_ = auVar122._4_4_ * auVar232._4_4_;
  auVar85._8_4_ = auVar122._8_4_ * auVar232._8_4_;
  auVar85._12_4_ = auVar122._12_4_ * auVar232._12_4_;
  auVar122 = vsubps_avx(auVar85,auVar266);
  auVar232 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar122 = vshufps_avx(auVar151,auVar151,0xc9);
  auVar171 = vshufps_avx(auVar167,auVar167,0xc9);
  fVar325 = auVar151._0_4_;
  auVar267._0_4_ = fVar325 * auVar171._0_4_;
  fVar331 = auVar151._4_4_;
  auVar267._4_4_ = fVar331 * auVar171._4_4_;
  fVar332 = auVar151._8_4_;
  auVar267._8_4_ = fVar332 * auVar171._8_4_;
  fVar333 = auVar151._12_4_;
  auVar267._12_4_ = fVar333 * auVar171._12_4_;
  auVar168._0_4_ = auVar122._0_4_ * auVar167._0_4_;
  auVar168._4_4_ = auVar122._4_4_ * auVar167._4_4_;
  auVar168._8_4_ = auVar122._8_4_ * auVar167._8_4_;
  auVar168._12_4_ = auVar122._12_4_ * auVar167._12_4_;
  auVar171 = vsubps_avx(auVar168,auVar267);
  auVar147 = vshufps_avx(auVar171,auVar171,0xc9);
  auVar171 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar268._0_4_ = fVar325 * auVar171._0_4_;
  auVar268._4_4_ = fVar331 * auVar171._4_4_;
  auVar268._8_4_ = fVar332 * auVar171._8_4_;
  auVar268._12_4_ = fVar333 * auVar171._12_4_;
  auVar196._0_4_ = auVar122._0_4_ * auVar121._0_4_;
  auVar196._4_4_ = auVar122._4_4_ * auVar121._4_4_;
  auVar196._8_4_ = auVar122._8_4_ * auVar121._8_4_;
  auVar196._12_4_ = auVar122._12_4_ * auVar121._12_4_;
  auVar122 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar171 = vsubps_avx(auVar196,auVar268);
  auVar121 = vshufps_avx(auVar171,auVar171,0xc9);
  fVar161 = auVar122._0_4_;
  auVar269._4_12_ = auVar348._4_12_;
  auVar269._0_4_ = fVar161;
  auVar171 = vrsqrtss_avx(auVar269,auVar269);
  fVar136 = auVar171._0_4_;
  auVar171 = ZEXT416((uint)(fVar136 * 1.5 - fVar161 * 0.5 * fVar136 * fVar136 * fVar136));
  auVar179 = vshufps_avx(auVar171,auVar171,0);
  fVar234 = auVar179._0_4_ * auVar18._0_4_;
  fVar235 = auVar179._4_4_ * auVar18._4_4_;
  fVar236 = auVar179._8_4_ * auVar18._8_4_;
  fVar214 = auVar179._12_4_ * auVar18._12_4_;
  auVar171 = vdpps_avx(auVar18,auVar232,0x7f);
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar86._0_4_ = auVar122._0_4_ * auVar232._0_4_;
  auVar86._4_4_ = auVar122._4_4_ * auVar232._4_4_;
  auVar86._8_4_ = auVar122._8_4_ * auVar232._8_4_;
  auVar86._12_4_ = auVar122._12_4_ * auVar232._12_4_;
  auVar122 = vshufps_avx(auVar171,auVar171,0);
  auVar220._0_4_ = auVar122._0_4_ * auVar18._0_4_;
  auVar220._4_4_ = auVar122._4_4_ * auVar18._4_4_;
  auVar220._8_4_ = auVar122._8_4_ * auVar18._8_4_;
  auVar220._12_4_ = auVar122._12_4_ * auVar18._12_4_;
  auVar19 = vsubps_avx(auVar86,auVar220);
  auVar122 = vrcpss_avx(auVar269,auVar269);
  auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar161 * auVar122._0_4_)));
  auVar18 = vshufps_avx(auVar122,auVar122,0);
  auVar122 = vdpps_avx(auVar147,auVar147,0x7f);
  fVar106 = auVar122._0_4_;
  auVar270._4_12_ = auVar348._4_12_;
  auVar270._0_4_ = fVar106;
  auVar171 = vrsqrtss_avx(auVar270,auVar270);
  fVar211 = auVar171._0_4_;
  auVar171 = vdpps_avx(auVar147,auVar121,0x7f);
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar343._0_4_ = auVar121._0_4_ * auVar122._0_4_;
  auVar343._4_4_ = auVar121._4_4_ * auVar122._4_4_;
  auVar343._8_4_ = auVar121._8_4_ * auVar122._8_4_;
  auVar343._12_4_ = auVar121._12_4_ * auVar122._12_4_;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar75);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar75);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar71);
  fVar136 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar163 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar72);
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  auVar122 = vshufps_avx(auVar171,auVar171,0);
  auVar87._0_4_ = auVar147._0_4_ * auVar122._0_4_;
  auVar87._4_4_ = auVar147._4_4_ * auVar122._4_4_;
  auVar87._8_4_ = auVar147._8_4_ * auVar122._8_4_;
  auVar87._12_4_ = auVar147._12_4_ * auVar122._12_4_;
  auVar121 = vsubps_avx(auVar343,auVar87);
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  fVar187 = *pfVar5;
  fVar188 = pfVar5[1];
  fVar189 = pfVar5[2];
  fVar190 = pfVar5[3];
  auVar122 = ZEXT416((uint)(fVar211 * 1.5 - fVar106 * 0.5 * fVar211 * fVar211 * fVar211));
  auVar171 = vshufps_avx(auVar122,auVar122,0);
  fVar211 = auVar171._0_4_ * auVar147._0_4_;
  fVar212 = auVar171._4_4_ * auVar147._4_4_;
  fVar213 = auVar171._8_4_ * auVar147._8_4_;
  fVar215 = auVar171._12_4_ * auVar147._12_4_;
  auVar122 = vrcpss_avx(auVar270,auVar270);
  auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - auVar122._0_4_ * fVar106)));
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar232 = vshufps_avx(_local_498,_local_498,0xff);
  auVar335._0_4_ = auVar232._0_4_ * fVar234;
  auVar335._4_4_ = auVar232._4_4_ * fVar235;
  auVar335._8_4_ = auVar232._8_4_ * fVar236;
  auVar335._12_4_ = auVar232._12_4_ * fVar214;
  auVar147 = vshufps_avx(auVar96,auVar96,0xff);
  auVar20 = vsubps_avx(_local_498,auVar335);
  auVar255._0_4_ =
       auVar147._0_4_ * fVar234 + auVar232._0_4_ * auVar179._0_4_ * auVar19._0_4_ * auVar18._0_4_;
  auVar255._4_4_ =
       auVar147._4_4_ * fVar235 + auVar232._4_4_ * auVar179._4_4_ * auVar19._4_4_ * auVar18._4_4_;
  auVar255._8_4_ =
       auVar147._8_4_ * fVar236 + auVar232._8_4_ * auVar179._8_4_ * auVar19._8_4_ * auVar18._8_4_;
  auVar255._12_4_ =
       auVar147._12_4_ * fVar214 +
       auVar232._12_4_ * auVar179._12_4_ * auVar19._12_4_ * auVar18._12_4_;
  auVar19 = vsubps_avx(auVar96,auVar255);
  local_498._0_4_ = (float)local_498._0_4_ + auVar335._0_4_;
  local_498._4_4_ = (float)local_498._4_4_ + auVar335._4_4_;
  fStack_490 = fStack_490 + auVar335._8_4_;
  fStack_48c = fStack_48c + auVar335._12_4_;
  auVar18 = vshufps_avx(auVar241,auVar241,0xff);
  auVar142._0_4_ = auVar18._0_4_ * fVar211;
  auVar142._4_4_ = auVar18._4_4_ * fVar212;
  auVar142._8_4_ = auVar18._8_4_ * fVar213;
  auVar142._12_4_ = auVar18._12_4_ * fVar215;
  auVar232 = vshufps_avx(auVar151,auVar151,0xff);
  auVar258 = vsubps_avx(auVar241,auVar142);
  auVar88._0_4_ =
       auVar232._0_4_ * fVar211 + auVar18._0_4_ * auVar171._0_4_ * auVar121._0_4_ * auVar122._0_4_;
  auVar88._4_4_ =
       auVar232._4_4_ * fVar212 + auVar18._4_4_ * auVar171._4_4_ * auVar121._4_4_ * auVar122._4_4_;
  auVar88._8_4_ =
       auVar232._8_4_ * fVar213 + auVar18._8_4_ * auVar171._8_4_ * auVar121._8_4_ * auVar122._8_4_;
  auVar88._12_4_ =
       auVar232._12_4_ * fVar215 +
       auVar18._12_4_ * auVar171._12_4_ * auVar121._12_4_ * auVar122._12_4_;
  auVar151 = vsubps_avx(auVar151,auVar88);
  local_3e8._4_4_ = auVar241._4_4_ + auVar142._4_4_;
  local_3e8._0_4_ = auVar241._0_4_ + auVar142._0_4_;
  fStack_3e0 = auVar241._8_4_ + auVar142._8_4_;
  fStack_3dc = auVar241._12_4_ + auVar142._12_4_;
  fVar284 = *pfVar4 * 0.0;
  fVar296 = pfVar4[1] * 0.0;
  fVar297 = pfVar4[2] * 0.0;
  fVar298 = pfVar4[3] * 0.0;
  fVar342 = fVar284 + fVar187 * 0.0;
  fVar349 = fVar296 + fVar188 * 0.0;
  fVar350 = fVar297 + fVar189 * 0.0;
  fVar351 = fVar298 + fVar190 * 0.0;
  auVar89._0_4_ = fVar342 + *pfVar3 * 3.0;
  auVar89._4_4_ = fVar349 + pfVar3[1] * 3.0;
  auVar89._8_4_ = fVar350 + pfVar3[2] * 3.0;
  auVar89._12_4_ = fVar351 + pfVar3[3] * 3.0;
  auVar143._0_4_ = fVar136 * 3.0;
  auVar143._4_4_ = fVar161 * 3.0;
  auVar143._8_4_ = fVar162 * 3.0;
  auVar143._12_4_ = fVar163 * 3.0;
  auVar80 = vsubps_avx(auVar89,auVar143);
  lVar15 = *(long *)(lVar14 + 0x38 + lVar75);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar75);
  pfVar5 = (float *)(lVar15 + lVar1 * lVar14);
  pfVar6 = (float *)(lVar15 + lVar14 * lVar2);
  fVar211 = *pfVar6;
  fVar212 = pfVar6[1];
  fVar213 = pfVar6[2];
  fVar215 = pfVar6[3];
  fVar106 = *pfVar5 * 0.0;
  fVar133 = pfVar5[1] * 0.0;
  fVar134 = pfVar5[2] * 0.0;
  fVar135 = pfVar5[3] * 0.0;
  fVar307 = fVar106 + fVar211 * 0.0;
  fVar315 = fVar133 + fVar212 * 0.0;
  fVar317 = fVar134 + fVar213 * 0.0;
  fVar319 = fVar135 + fVar215 * 0.0;
  pfVar6 = (float *)(lVar15 + lVar72 * lVar14);
  auVar336._0_4_ = *pfVar6 * 3.0 + fVar307;
  auVar336._4_4_ = pfVar6[1] * 3.0 + fVar315;
  auVar336._8_4_ = pfVar6[2] * 3.0 + fVar317;
  auVar336._12_4_ = pfVar6[3] * 3.0 + fVar319;
  pfVar7 = (float *)(lVar15 + uVar71 * lVar14);
  fVar234 = *pfVar7;
  fVar235 = pfVar7[1];
  fVar236 = pfVar7[2];
  fVar214 = pfVar7[3];
  auVar271._0_4_ = fVar234 * 3.0;
  auVar271._4_4_ = fVar235 * 3.0;
  auVar271._8_4_ = fVar236 * 3.0;
  auVar271._12_4_ = fVar214 * 3.0;
  auVar171 = vsubps_avx(auVar336,auVar271);
  auVar272._0_4_ = fVar187 * 3.0;
  auVar272._4_4_ = fVar188 * 3.0;
  auVar272._8_4_ = fVar189 * 3.0;
  auVar272._12_4_ = fVar190 * 3.0;
  auVar322._0_4_ = *pfVar4 * 3.0;
  auVar322._4_4_ = pfVar4[1] * 3.0;
  auVar322._8_4_ = pfVar4[2] * 3.0;
  auVar322._12_4_ = pfVar4[3] * 3.0;
  auVar122 = vsubps_avx(auVar272,auVar322);
  fVar308 = *pfVar3 * 0.0;
  fVar316 = pfVar3[1] * 0.0;
  fVar318 = pfVar3[2] * 0.0;
  fVar320 = pfVar3[3] * 0.0;
  auVar273._0_4_ = fVar308 + auVar122._0_4_;
  auVar273._4_4_ = fVar316 + auVar122._4_4_;
  auVar273._8_4_ = fVar318 + auVar122._8_4_;
  auVar273._12_4_ = fVar320 + auVar122._12_4_;
  auVar323._0_4_ = fVar136 + fVar308 + fVar342;
  auVar323._4_4_ = fVar161 + fVar316 + fVar349;
  auVar323._8_4_ = fVar162 + fVar318 + fVar350;
  auVar323._12_4_ = fVar163 + fVar320 + fVar351;
  auVar300._0_4_ = fVar136 * 0.0;
  auVar300._4_4_ = fVar161 * 0.0;
  auVar300._8_4_ = fVar162 * 0.0;
  auVar300._12_4_ = fVar163 * 0.0;
  local_458._0_4_ = auVar300._0_4_ + fVar308 + fVar187 + fVar284;
  local_458._4_4_ = auVar300._4_4_ + fVar316 + fVar188 + fVar296;
  fStack_450 = auVar300._8_4_ + fVar318 + fVar189 + fVar297;
  fStack_44c = auVar300._12_4_ + fVar320 + fVar190 + fVar298;
  auVar81 = vsubps_avx(auVar273,auVar300);
  auVar109._0_4_ = fVar211 * 3.0;
  auVar109._4_4_ = fVar212 * 3.0;
  auVar109._8_4_ = fVar213 * 3.0;
  auVar109._12_4_ = fVar215 * 3.0;
  auVar197._0_4_ = *pfVar5 * 3.0;
  auVar197._4_4_ = pfVar5[1] * 3.0;
  auVar197._8_4_ = pfVar5[2] * 3.0;
  auVar197._12_4_ = pfVar5[3] * 3.0;
  auVar122 = vsubps_avx(auVar109,auVar197);
  fVar136 = *pfVar6 * 0.0;
  fVar161 = pfVar6[1] * 0.0;
  fVar162 = pfVar6[2] * 0.0;
  fVar163 = pfVar6[3] * 0.0;
  auVar110._0_4_ = fVar136 + auVar122._0_4_;
  auVar110._4_4_ = fVar161 + auVar122._4_4_;
  auVar110._8_4_ = fVar162 + auVar122._8_4_;
  auVar110._12_4_ = fVar163 + auVar122._12_4_;
  auVar144._0_4_ = fVar234 + fVar136 + fVar307;
  auVar144._4_4_ = fVar235 + fVar161 + fVar315;
  auVar144._8_4_ = fVar236 + fVar162 + fVar317;
  auVar144._12_4_ = fVar214 + fVar163 + fVar319;
  auVar90._0_4_ = fVar234 * 0.0;
  auVar90._4_4_ = fVar235 * 0.0;
  auVar90._8_4_ = fVar236 * 0.0;
  auVar90._12_4_ = fVar214 * 0.0;
  auVar169._0_4_ = auVar90._0_4_ + fVar136 + fVar106 + fVar211;
  auVar169._4_4_ = auVar90._4_4_ + fVar161 + fVar133 + fVar212;
  auVar169._8_4_ = auVar90._8_4_ + fVar162 + fVar134 + fVar213;
  auVar169._12_4_ = auVar90._12_4_ + fVar163 + fVar135 + fVar215;
  auVar232 = vsubps_avx(auVar110,auVar90);
  auVar122 = vshufps_avx(auVar144,auVar144,0xc9);
  fVar190 = auVar80._0_4_;
  auVar111._0_4_ = fVar190 * auVar122._0_4_;
  fVar211 = auVar80._4_4_;
  auVar111._4_4_ = fVar211 * auVar122._4_4_;
  fVar212 = auVar80._8_4_;
  auVar111._8_4_ = fVar212 * auVar122._8_4_;
  fVar213 = auVar80._12_4_;
  auVar111._12_4_ = fVar213 * auVar122._12_4_;
  auVar122 = vshufps_avx(auVar80,auVar80,0xc9);
  auVar145._0_4_ = auVar122._0_4_ * auVar144._0_4_;
  auVar145._4_4_ = auVar122._4_4_ * auVar144._4_4_;
  auVar145._8_4_ = auVar122._8_4_ * auVar144._8_4_;
  auVar145._12_4_ = auVar122._12_4_ * auVar144._12_4_;
  auVar18 = vsubps_avx(auVar145,auVar111);
  auVar146._0_4_ = auVar171._0_4_ * auVar122._0_4_;
  auVar146._4_4_ = auVar171._4_4_ * auVar122._4_4_;
  auVar146._8_4_ = auVar171._8_4_ * auVar122._8_4_;
  auVar146._12_4_ = auVar171._12_4_ * auVar122._12_4_;
  auVar122 = vshufps_avx(auVar171,auVar171,0xc9);
  auVar198._0_4_ = fVar190 * auVar122._0_4_;
  auVar198._4_4_ = fVar211 * auVar122._4_4_;
  auVar198._8_4_ = fVar212 * auVar122._8_4_;
  auVar198._12_4_ = fVar213 * auVar122._12_4_;
  auVar147 = vsubps_avx(auVar146,auVar198);
  auVar122 = vshufps_avx(auVar169,auVar169,0xc9);
  fVar215 = auVar81._0_4_;
  auVar199._0_4_ = fVar215 * auVar122._0_4_;
  fVar234 = auVar81._4_4_;
  auVar199._4_4_ = fVar234 * auVar122._4_4_;
  fVar235 = auVar81._8_4_;
  auVar199._8_4_ = fVar235 * auVar122._8_4_;
  fVar236 = auVar81._12_4_;
  auVar199._12_4_ = fVar236 * auVar122._12_4_;
  auVar122 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar170._0_4_ = auVar122._0_4_ * auVar169._0_4_;
  auVar170._4_4_ = auVar122._4_4_ * auVar169._4_4_;
  auVar170._8_4_ = auVar122._8_4_ * auVar169._8_4_;
  auVar170._12_4_ = auVar122._12_4_ * auVar169._12_4_;
  auVar121 = vsubps_avx(auVar170,auVar199);
  auVar18 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar112._0_4_ = auVar122._0_4_ * auVar232._0_4_;
  auVar112._4_4_ = auVar122._4_4_ * auVar232._4_4_;
  auVar112._8_4_ = auVar122._8_4_ * auVar232._8_4_;
  auVar112._12_4_ = auVar122._12_4_ * auVar232._12_4_;
  auVar171 = vshufps_avx(auVar232,auVar232,0xc9);
  auVar122 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar91._0_4_ = fVar215 * auVar171._0_4_;
  auVar91._4_4_ = fVar234 * auVar171._4_4_;
  auVar91._8_4_ = fVar235 * auVar171._8_4_;
  auVar91._12_4_ = fVar236 * auVar171._12_4_;
  auVar179 = vsubps_avx(auVar112,auVar91);
  auVar232 = vshufps_avx(auVar147,auVar147,0xc9);
  fVar136 = auVar122._0_4_;
  auVar147 = ZEXT416((uint)fVar136);
  auVar171 = vrsqrtss_avx(auVar147,auVar147);
  fVar161 = auVar171._0_4_;
  auVar171 = vdpps_avx(auVar18,auVar232,0x7f);
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar92._0_4_ = auVar122._0_4_ * auVar232._0_4_;
  auVar92._4_4_ = auVar122._4_4_ * auVar232._4_4_;
  auVar92._8_4_ = auVar122._8_4_ * auVar232._8_4_;
  auVar92._12_4_ = auVar122._12_4_ * auVar232._12_4_;
  auVar122 = vshufps_avx(auVar171,auVar171,0);
  auVar221._0_4_ = auVar18._0_4_ * auVar122._0_4_;
  auVar221._4_4_ = auVar18._4_4_ * auVar122._4_4_;
  auVar221._8_4_ = auVar18._8_4_ * auVar122._8_4_;
  auVar221._12_4_ = auVar18._12_4_ * auVar122._12_4_;
  auVar82 = vsubps_avx(auVar92,auVar221);
  auVar122 = vrcpss_avx(auVar147,auVar147);
  auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar136 * auVar122._0_4_)));
  auVar232 = vshufps_avx(auVar122,auVar122,0);
  auVar147 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar122 = ZEXT416((uint)(fVar161 * 1.5 - fVar136 * 0.5 * fVar161 * fVar161 * fVar161));
  auVar121 = vshufps_avx(auVar122,auVar122,0);
  auVar171 = vdpps_avx(auVar147,auVar147,0x7f);
  fVar187 = auVar18._0_4_ * auVar121._0_4_;
  fVar188 = auVar18._4_4_ * auVar121._4_4_;
  fVar189 = auVar18._8_4_ * auVar121._8_4_;
  fVar214 = auVar18._12_4_ * auVar121._12_4_;
  auVar179 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar122 = vblendps_avx(auVar171,_DAT_01feba10,0xe);
  auVar18 = vrsqrtss_avx(auVar122,auVar122);
  fVar136 = auVar18._0_4_;
  auVar18 = vdpps_avx(auVar147,auVar179,0x7f);
  auVar96 = vshufps_avx(auVar171,auVar171,0);
  auVar113._0_4_ = auVar96._0_4_ * auVar179._0_4_;
  auVar113._4_4_ = auVar96._4_4_ * auVar179._4_4_;
  auVar113._8_4_ = auVar96._8_4_ * auVar179._8_4_;
  auVar113._12_4_ = auVar96._12_4_ * auVar179._12_4_;
  auVar18 = vshufps_avx(auVar18,auVar18,0);
  auVar222._0_4_ = auVar147._0_4_ * auVar18._0_4_;
  auVar222._4_4_ = auVar147._4_4_ * auVar18._4_4_;
  auVar222._8_4_ = auVar147._8_4_ * auVar18._8_4_;
  auVar222._12_4_ = auVar147._12_4_ * auVar18._12_4_;
  auVar179 = vsubps_avx(auVar113,auVar222);
  auVar122 = vrcpss_avx(auVar122,auVar122);
  auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - auVar171._0_4_ * auVar122._0_4_)));
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  auVar171 = ZEXT416((uint)(fVar136 * 1.5 - auVar171._0_4_ * 0.5 * fVar136 * fVar136 * fVar136));
  auVar171 = vshufps_avx(auVar171,auVar171,0);
  fVar136 = auVar147._0_4_ * auVar171._0_4_;
  fVar161 = auVar147._4_4_ * auVar171._4_4_;
  fVar162 = auVar147._8_4_ * auVar171._8_4_;
  fVar163 = auVar147._12_4_ * auVar171._12_4_;
  auVar18 = vshufps_avx(auVar80,auVar80,0xff);
  auVar147 = vshufps_avx(auVar323,auVar323,0xff);
  auVar200._0_4_ = fVar187 * auVar147._0_4_;
  auVar200._4_4_ = fVar188 * auVar147._4_4_;
  auVar200._8_4_ = fVar189 * auVar147._8_4_;
  auVar200._12_4_ = fVar214 * auVar147._12_4_;
  auVar148._0_4_ =
       fVar187 * auVar18._0_4_ + auVar121._0_4_ * auVar82._0_4_ * auVar232._0_4_ * auVar147._0_4_;
  auVar148._4_4_ =
       fVar188 * auVar18._4_4_ + auVar121._4_4_ * auVar82._4_4_ * auVar232._4_4_ * auVar147._4_4_;
  auVar148._8_4_ =
       fVar189 * auVar18._8_4_ + auVar121._8_4_ * auVar82._8_4_ * auVar232._8_4_ * auVar147._8_4_;
  auVar148._12_4_ =
       fVar214 * auVar18._12_4_ +
       auVar121._12_4_ * auVar82._12_4_ * auVar232._12_4_ * auVar147._12_4_;
  auVar147 = vsubps_avx(auVar323,auVar200);
  auVar121 = vsubps_avx(auVar80,auVar148);
  auVar18 = vshufps_avx(auVar81,auVar81,0xff);
  auVar232 = vshufps_avx(_local_458,_local_458,0xff);
  auVar93._0_4_ = auVar232._0_4_ * fVar136;
  auVar93._4_4_ = auVar232._4_4_ * fVar161;
  auVar93._8_4_ = auVar232._8_4_ * fVar162;
  auVar93._12_4_ = auVar232._12_4_ * fVar163;
  auVar114._0_4_ =
       auVar18._0_4_ * fVar136 + auVar232._0_4_ * auVar171._0_4_ * auVar179._0_4_ * auVar122._0_4_;
  auVar114._4_4_ =
       auVar18._4_4_ * fVar161 + auVar232._4_4_ * auVar171._4_4_ * auVar179._4_4_ * auVar122._4_4_;
  auVar114._8_4_ =
       auVar18._8_4_ * fVar162 + auVar232._8_4_ * auVar171._8_4_ * auVar179._8_4_ * auVar122._8_4_;
  auVar114._12_4_ =
       auVar18._12_4_ * fVar163 +
       auVar232._12_4_ * auVar171._12_4_ * auVar179._12_4_ * auVar122._12_4_;
  auVar18 = vsubps_avx(_local_458,auVar93);
  local_458._0_4_ = (float)local_458._0_4_ + auVar93._0_4_;
  local_458._4_4_ = (float)local_458._4_4_ + auVar93._4_4_;
  fStack_450 = fStack_450 + auVar93._8_4_;
  fStack_44c = fStack_44c + auVar93._12_4_;
  auVar232 = vsubps_avx(auVar81,auVar114);
  local_3a8._0_4_ = auVar19._0_4_;
  local_3a8._4_4_ = auVar19._4_4_;
  fStack_3a0 = auVar19._8_4_;
  fStack_39c = auVar19._12_4_;
  local_438._0_4_ = auVar20._0_4_;
  local_438._4_4_ = auVar20._4_4_;
  fStack_430 = auVar20._8_4_;
  fStack_42c = auVar20._12_4_;
  auVar122 = vshufps_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),0);
  auVar171 = vshufps_avx(ZEXT416((uint)(1.0 - fVar79)),ZEXT416((uint)(1.0 - fVar79)),0);
  fVar163 = auVar122._0_4_;
  fVar187 = auVar122._4_4_;
  fVar188 = auVar122._8_4_;
  fVar189 = auVar122._12_4_;
  fVar79 = auVar171._0_4_;
  fVar136 = auVar171._4_4_;
  fVar161 = auVar171._8_4_;
  fVar162 = auVar171._12_4_;
  local_318._0_4_ = fVar79 * (float)local_438._0_4_ + fVar163 * auVar147._0_4_;
  local_318._4_4_ = fVar136 * (float)local_438._4_4_ + fVar187 * auVar147._4_4_;
  fStack_310 = fVar161 * fStack_430 + fVar188 * auVar147._8_4_;
  fStack_30c = fVar162 * fStack_42c + fVar189 * auVar147._12_4_;
  local_328._0_4_ =
       fVar79 * ((float)local_438._0_4_ + (float)local_3a8._0_4_ * 0.33333334) +
       fVar163 * (auVar147._0_4_ + auVar121._0_4_ * 0.33333334);
  local_328._4_4_ =
       fVar136 * ((float)local_438._4_4_ + (float)local_3a8._4_4_ * 0.33333334) +
       fVar187 * (auVar147._4_4_ + auVar121._4_4_ * 0.33333334);
  fStack_320 = fVar161 * (fStack_430 + fStack_3a0 * 0.33333334) +
               fVar188 * (auVar147._8_4_ + auVar121._8_4_ * 0.33333334);
  fStack_31c = fVar162 * (fStack_42c + fStack_39c * 0.33333334) +
               fVar189 * (auVar147._12_4_ + auVar121._12_4_ * 0.33333334);
  local_418._0_4_ = auVar151._0_4_;
  local_418._4_4_ = auVar151._4_4_;
  fStack_410 = auVar151._8_4_;
  fStack_40c = auVar151._12_4_;
  auVar172._0_4_ = (float)local_418._0_4_ * 0.33333334;
  auVar172._4_4_ = (float)local_418._4_4_ * 0.33333334;
  auVar172._8_4_ = fStack_410 * 0.33333334;
  auVar172._12_4_ = fStack_40c * 0.33333334;
  auVar122 = vsubps_avx(auVar258,auVar172);
  auVar223._0_4_ = (fVar325 + auVar88._0_4_) * 0.33333334;
  auVar223._4_4_ = (fVar331 + auVar88._4_4_) * 0.33333334;
  auVar223._8_4_ = (fVar332 + auVar88._8_4_) * 0.33333334;
  auVar223._12_4_ = (fVar333 + auVar88._12_4_) * 0.33333334;
  auVar171 = vsubps_avx(_local_3e8,auVar223);
  auVar149._0_4_ = auVar232._0_4_ * 0.33333334;
  auVar149._4_4_ = auVar232._4_4_ * 0.33333334;
  auVar149._8_4_ = auVar232._8_4_ * 0.33333334;
  auVar149._12_4_ = auVar232._12_4_ * 0.33333334;
  auVar232 = vsubps_avx(auVar18,auVar149);
  auVar115._0_4_ = (fVar215 + auVar114._0_4_) * 0.33333334;
  auVar115._4_4_ = (fVar234 + auVar114._4_4_) * 0.33333334;
  auVar115._8_4_ = (fVar235 + auVar114._8_4_) * 0.33333334;
  auVar115._12_4_ = (fVar236 + auVar114._12_4_) * 0.33333334;
  auVar147 = vsubps_avx(_local_458,auVar115);
  local_338._0_4_ = fVar79 * auVar122._0_4_ + fVar163 * auVar232._0_4_;
  local_338._4_4_ = fVar136 * auVar122._4_4_ + fVar187 * auVar232._4_4_;
  fStack_330 = fVar161 * auVar122._8_4_ + fVar188 * auVar232._8_4_;
  fStack_32c = fVar162 * auVar122._12_4_ + fVar189 * auVar232._12_4_;
  local_348._0_4_ = fVar163 * auVar18._0_4_ + auVar258._0_4_ * fVar79;
  local_348._4_4_ = fVar187 * auVar18._4_4_ + auVar258._4_4_ * fVar136;
  fStack_340 = fVar188 * auVar18._8_4_ + auVar258._8_4_ * fVar161;
  fStack_33c = fVar189 * auVar18._12_4_ + auVar258._12_4_ * fVar162;
  local_358._0_4_ = fVar79 * (float)local_498._0_4_ + fVar163 * (auVar323._0_4_ + auVar200._0_4_);
  local_358._4_4_ = fVar136 * (float)local_498._4_4_ + fVar187 * (auVar323._4_4_ + auVar200._4_4_);
  fStack_350 = fVar161 * fStack_490 + fVar188 * (auVar323._8_4_ + auVar200._8_4_);
  fStack_34c = fVar162 * fStack_48c + fVar189 * (auVar323._12_4_ + auVar200._12_4_);
  local_368._0_4_ =
       ((float)local_498._0_4_ + (fVar78 + auVar255._0_4_) * 0.33333334) * fVar79 +
       fVar163 * (auVar323._0_4_ + auVar200._0_4_ + (fVar190 + auVar148._0_4_) * 0.33333334);
  local_368._4_4_ =
       ((float)local_498._4_4_ + (fVar103 + auVar255._4_4_) * 0.33333334) * fVar136 +
       fVar187 * (auVar323._4_4_ + auVar200._4_4_ + (fVar211 + auVar148._4_4_) * 0.33333334);
  fStack_360 = (fStack_490 + (fVar104 + auVar255._8_4_) * 0.33333334) * fVar161 +
               fVar188 * (auVar323._8_4_ + auVar200._8_4_ + (fVar212 + auVar148._8_4_) * 0.33333334)
  ;
  fStack_35c = (fStack_48c + (fVar105 + auVar255._12_4_) * 0.33333334) * fVar162 +
               fVar189 * (auVar323._12_4_ + auVar200._12_4_ +
                         (fVar213 + auVar148._12_4_) * 0.33333334);
  local_488._0_4_ = auVar171._0_4_;
  local_488._4_4_ = auVar171._4_4_;
  fStack_480 = auVar171._8_4_;
  fStack_47c = auVar171._12_4_;
  local_378 = fVar79 * (float)local_488._0_4_ + fVar163 * auVar147._0_4_;
  fStack_374 = fVar136 * (float)local_488._4_4_ + fVar187 * auVar147._4_4_;
  fStack_370 = fVar161 * fStack_480 + fVar188 * auVar147._8_4_;
  fStack_36c = fVar162 * fStack_47c + fVar189 * auVar147._12_4_;
  local_388 = (auVar241._0_4_ + auVar142._0_4_) * fVar79 + fVar163 * (float)local_458._0_4_;
  fStack_384 = (auVar241._4_4_ + auVar142._4_4_) * fVar136 + fVar187 * (float)local_458._4_4_;
  fStack_380 = (auVar241._8_4_ + auVar142._8_4_) * fVar161 + fVar188 * fStack_450;
  fStack_37c = (auVar241._12_4_ + auVar142._12_4_) * fVar162 + fVar189 * fStack_44c;
  aVar10 = (ray->org).field_0;
  auVar18 = vsubps_avx(_local_318,(undefined1  [16])aVar10);
  auVar171 = vmovsldup_avx(auVar18);
  auVar122 = vmovshdup_avx(auVar18);
  auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
  fVar79 = (pre->ray_space).vx.field_0.m128[0];
  fVar136 = (pre->ray_space).vx.field_0.m128[1];
  fVar161 = (pre->ray_space).vx.field_0.m128[2];
  fVar162 = (pre->ray_space).vx.field_0.m128[3];
  fVar163 = (pre->ray_space).vy.field_0.m128[0];
  fVar187 = (pre->ray_space).vy.field_0.m128[1];
  fVar188 = (pre->ray_space).vy.field_0.m128[2];
  fVar189 = (pre->ray_space).vy.field_0.m128[3];
  fVar190 = (pre->ray_space).vz.field_0.m128[0];
  fVar211 = (pre->ray_space).vz.field_0.m128[1];
  fVar212 = (pre->ray_space).vz.field_0.m128[2];
  fVar213 = (pre->ray_space).vz.field_0.m128[3];
  local_488._4_4_ = fVar136 * auVar171._4_4_ + fVar187 * auVar122._4_4_ + fVar211 * auVar18._4_4_;
  local_488._0_4_ = fVar79 * auVar171._0_4_ + fVar163 * auVar122._0_4_ + fVar190 * auVar18._0_4_;
  fStack_480 = fVar161 * auVar171._8_4_ + fVar188 * auVar122._8_4_ + fVar212 * auVar18._8_4_;
  fStack_47c = fVar162 * auVar171._12_4_ + fVar189 * auVar122._12_4_ + fVar213 * auVar18._12_4_;
  auVar18 = vsubps_avx(_local_328,(undefined1  [16])aVar10);
  auVar171 = vmovsldup_avx(auVar18);
  auVar122 = vmovshdup_avx(auVar18);
  auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
  local_498._4_4_ = fVar136 * auVar171._4_4_ + fVar187 * auVar122._4_4_ + fVar211 * auVar18._4_4_;
  local_498._0_4_ = fVar79 * auVar171._0_4_ + fVar163 * auVar122._0_4_ + fVar190 * auVar18._0_4_;
  fStack_490 = fVar161 * auVar171._8_4_ + fVar188 * auVar122._8_4_ + fVar212 * auVar18._8_4_;
  fStack_48c = fVar162 * auVar171._12_4_ + fVar189 * auVar122._12_4_ + fVar213 * auVar18._12_4_;
  auVar171 = vsubps_avx(_local_338,(undefined1  [16])aVar10);
  auVar18 = vshufps_avx(auVar171,auVar171,0xaa);
  auVar122 = vmovshdup_avx(auVar171);
  auVar171 = vmovsldup_avx(auVar171);
  auVar116._0_8_ =
       CONCAT44(fVar136 * auVar171._4_4_ + auVar122._4_4_ * fVar187 + fVar211 * auVar18._4_4_,
                fVar79 * auVar171._0_4_ + auVar122._0_4_ * fVar163 + fVar190 * auVar18._0_4_);
  auVar116._8_4_ = fVar161 * auVar171._8_4_ + auVar122._8_4_ * fVar188 + fVar212 * auVar18._8_4_;
  auVar116._12_4_ = fVar162 * auVar171._12_4_ + auVar122._12_4_ * fVar189 + fVar213 * auVar18._12_4_
  ;
  auVar171 = vsubps_avx(_local_348,(undefined1  [16])aVar10);
  auVar18 = vshufps_avx(auVar171,auVar171,0xaa);
  auVar122 = vmovshdup_avx(auVar171);
  auVar171 = vmovsldup_avx(auVar171);
  auVar256._0_4_ = auVar122._0_4_ * fVar163 + auVar18._0_4_ * fVar190 + fVar79 * auVar171._0_4_;
  auVar256._4_4_ = auVar122._4_4_ * fVar187 + auVar18._4_4_ * fVar211 + fVar136 * auVar171._4_4_;
  auVar256._8_4_ = auVar122._8_4_ * fVar188 + auVar18._8_4_ * fVar212 + fVar161 * auVar171._8_4_;
  auVar256._12_4_ = auVar122._12_4_ * fVar189 + auVar18._12_4_ * fVar213 + fVar162 * auVar171._12_4_
  ;
  auVar171 = vsubps_avx(_local_358,(undefined1  [16])aVar10);
  auVar18 = vshufps_avx(auVar171,auVar171,0xaa);
  auVar122 = vmovshdup_avx(auVar171);
  auVar171 = vmovsldup_avx(auVar171);
  auVar274._0_4_ = auVar171._0_4_ * fVar79 + auVar122._0_4_ * fVar163 + auVar18._0_4_ * fVar190;
  auVar274._4_4_ = auVar171._4_4_ * fVar136 + auVar122._4_4_ * fVar187 + auVar18._4_4_ * fVar211;
  auVar274._8_4_ = auVar171._8_4_ * fVar161 + auVar122._8_4_ * fVar188 + auVar18._8_4_ * fVar212;
  auVar274._12_4_ = auVar171._12_4_ * fVar162 + auVar122._12_4_ * fVar189 + auVar18._12_4_ * fVar213
  ;
  auVar171 = vsubps_avx(_local_368,(undefined1  [16])aVar10);
  auVar18 = vshufps_avx(auVar171,auVar171,0xaa);
  auVar122 = vmovshdup_avx(auVar171);
  auVar171 = vmovsldup_avx(auVar171);
  auVar286._0_4_ = auVar171._0_4_ * fVar79 + auVar122._0_4_ * fVar163 + auVar18._0_4_ * fVar190;
  auVar286._4_4_ = auVar171._4_4_ * fVar136 + auVar122._4_4_ * fVar187 + auVar18._4_4_ * fVar211;
  auVar286._8_4_ = auVar171._8_4_ * fVar161 + auVar122._8_4_ * fVar188 + auVar18._8_4_ * fVar212;
  auVar286._12_4_ = auVar171._12_4_ * fVar162 + auVar122._12_4_ * fVar189 + auVar18._12_4_ * fVar213
  ;
  auVar63._4_4_ = fStack_374;
  auVar63._0_4_ = local_378;
  auVar63._8_4_ = fStack_370;
  auVar63._12_4_ = fStack_36c;
  auVar171 = vsubps_avx(auVar63,(undefined1  [16])aVar10);
  auVar18 = vshufps_avx(auVar171,auVar171,0xaa);
  auVar122 = vmovshdup_avx(auVar171);
  auVar171 = vmovsldup_avx(auVar171);
  auVar301._0_4_ = auVar171._0_4_ * fVar79 + auVar122._0_4_ * fVar163 + auVar18._0_4_ * fVar190;
  auVar301._4_4_ = auVar171._4_4_ * fVar136 + auVar122._4_4_ * fVar187 + auVar18._4_4_ * fVar211;
  auVar301._8_4_ = auVar171._8_4_ * fVar161 + auVar122._8_4_ * fVar188 + auVar18._8_4_ * fVar212;
  auVar301._12_4_ = auVar171._12_4_ * fVar162 + auVar122._12_4_ * fVar189 + auVar18._12_4_ * fVar213
  ;
  auVar60._4_4_ = fStack_384;
  auVar60._0_4_ = local_388;
  auVar60._8_4_ = fStack_380;
  auVar60._12_4_ = fStack_37c;
  auVar171 = vsubps_avx(auVar60,(undefined1  [16])aVar10);
  auVar18 = vshufps_avx(auVar171,auVar171,0xaa);
  auVar122 = vmovshdup_avx(auVar171);
  auVar171 = vmovsldup_avx(auVar171);
  auVar94._0_8_ =
       CONCAT44(fVar136 * auVar171._4_4_ + auVar122._4_4_ * fVar187 + auVar18._4_4_ * fVar211,
                fVar79 * auVar171._0_4_ + auVar122._0_4_ * fVar163 + auVar18._0_4_ * fVar190);
  auVar94._8_4_ = fVar161 * auVar171._8_4_ + auVar122._8_4_ * fVar188 + auVar18._8_4_ * fVar212;
  auVar94._12_4_ = fVar162 * auVar171._12_4_ + auVar122._12_4_ * fVar189 + auVar18._12_4_ * fVar213;
  _local_3f8 = vmovlhps_avx(_local_488,auVar274);
  _local_408 = vmovlhps_avx(_local_498,auVar286);
  _local_418 = vmovlhps_avx(auVar116,auVar301);
  _local_288 = vmovlhps_avx(auVar256,auVar94);
  auVar122 = vminps_avx(_local_3f8,_local_408);
  auVar171 = vminps_avx(_local_418,_local_288);
  auVar18 = vminps_avx(auVar122,auVar171);
  auVar122 = vmaxps_avx(_local_3f8,_local_408);
  auVar171 = vmaxps_avx(_local_418,_local_288);
  auVar122 = vmaxps_avx(auVar122,auVar171);
  auVar171 = vshufpd_avx(auVar18,auVar18,3);
  auVar18 = vminps_avx(auVar18,auVar171);
  auVar171 = vshufpd_avx(auVar122,auVar122,3);
  auVar171 = vmaxps_avx(auVar122,auVar171);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar122 = vandps_avx(auVar18,auVar242);
  auVar171 = vandps_avx(auVar171,auVar242);
  auVar122 = vmaxps_avx(auVar122,auVar171);
  auVar171 = vmovshdup_avx(auVar122);
  auVar122 = vmaxss_avx(auVar171,auVar122);
  fVar79 = auVar122._0_4_ * 9.536743e-07;
  register0x00001388 = local_488;
  local_2e8 = local_488;
  register0x00001548 = local_498;
  local_278 = local_498;
  register0x00001588 = auVar116._0_8_;
  local_2f8 = auVar116._0_8_;
  register0x000013c8 = auVar94._0_8_;
  local_308 = auVar94._0_8_;
  auVar122 = vshufps_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),0);
  local_138._16_16_ = auVar122;
  local_138._0_16_ = auVar122;
  auVar95._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
  auVar95._8_4_ = auVar122._8_4_ ^ 0x80000000;
  auVar95._12_4_ = auVar122._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar95;
  local_158._0_16_ = auVar95;
  bVar66 = false;
  uVar71 = 0;
  _local_1a8 = vsubps_avx(_local_408,_local_3f8);
  _local_1b8 = vsubps_avx(_local_418,_local_408);
  _local_1c8 = vsubps_avx(_local_288,_local_418);
  _local_1f8 = vsubps_avx(_local_358,_local_318);
  _local_208 = vsubps_avx(_local_368,_local_328);
  auVar64._4_4_ = fStack_374;
  auVar64._0_4_ = local_378;
  auVar64._8_4_ = fStack_370;
  auVar64._12_4_ = fStack_36c;
  _local_218 = vsubps_avx(auVar64,_local_338);
  auVar61._4_4_ = fStack_384;
  auVar61._0_4_ = local_388;
  auVar61._8_4_ = fStack_380;
  auVar61._12_4_ = fStack_37c;
  _local_228 = vsubps_avx(auVar61,_local_348);
  _local_498 = ZEXT816(0x3f80000000000000);
  local_1d8 = _local_498;
  do {
    auVar122 = vshufps_avx(_local_498,_local_498,0x50);
    auVar344._8_4_ = 0x3f800000;
    auVar344._0_8_ = &DAT_3f8000003f800000;
    auVar344._12_4_ = 0x3f800000;
    auVar347._16_4_ = 0x3f800000;
    auVar347._0_16_ = auVar344;
    auVar347._20_4_ = 0x3f800000;
    auVar347._24_4_ = 0x3f800000;
    auVar347._28_4_ = 0x3f800000;
    auVar171 = vsubps_avx(auVar344,auVar122);
    fVar136 = auVar122._0_4_;
    fVar161 = auVar122._4_4_;
    fVar162 = auVar122._8_4_;
    fVar163 = auVar122._12_4_;
    fVar187 = auVar171._0_4_;
    fVar188 = auVar171._4_4_;
    fVar189 = auVar171._8_4_;
    fVar190 = auVar171._12_4_;
    auVar150._0_4_ = auVar274._0_4_ * fVar136 + fVar187 * local_2e8._0_4_;
    auVar150._4_4_ = auVar274._4_4_ * fVar161 + fVar188 * local_2e8._4_4_;
    auVar150._8_4_ = auVar274._0_4_ * fVar162 + fVar189 * local_2e8._8_4_;
    auVar150._12_4_ = auVar274._4_4_ * fVar163 + fVar190 * local_2e8._12_4_;
    auVar117._0_4_ = auVar286._0_4_ * fVar136 + local_278._0_4_ * fVar187;
    auVar117._4_4_ = auVar286._4_4_ * fVar161 + local_278._4_4_ * fVar188;
    auVar117._8_4_ = auVar286._0_4_ * fVar162 + local_278._8_4_ * fVar189;
    auVar117._12_4_ = auVar286._4_4_ * fVar163 + local_278._12_4_ * fVar190;
    auVar257._0_4_ = auVar301._0_4_ * fVar136 + local_2f8._0_4_ * fVar187;
    auVar257._4_4_ = auVar301._4_4_ * fVar161 + local_2f8._4_4_ * fVar188;
    auVar257._8_4_ = auVar301._0_4_ * fVar162 + local_2f8._8_4_ * fVar189;
    auVar257._12_4_ = auVar301._4_4_ * fVar163 + local_2f8._12_4_ * fVar190;
    auVar173._0_4_ = local_308._0_4_ * fVar136 + auVar256._0_4_ * fVar187;
    auVar173._4_4_ = local_308._4_4_ * fVar161 + auVar256._4_4_ * fVar188;
    auVar173._8_4_ = local_308._8_4_ * fVar162 + auVar256._0_4_ * fVar189;
    auVar173._12_4_ = local_308._12_4_ * fVar163 + auVar256._4_4_ * fVar190;
    auVar122 = vmovshdup_avx(local_1d8);
    auVar171 = vshufps_avx(local_1d8,local_1d8,0);
    auVar282._16_16_ = auVar171;
    auVar282._0_16_ = auVar171;
    auVar18 = vshufps_avx(local_1d8,local_1d8,0x55);
    auVar100._16_16_ = auVar18;
    auVar100._0_16_ = auVar18;
    auVar99 = vsubps_avx(auVar100,auVar282);
    auVar18 = vshufps_avx(auVar150,auVar150,0);
    auVar232 = vshufps_avx(auVar150,auVar150,0x55);
    auVar147 = vshufps_avx(auVar117,auVar117,0);
    auVar121 = vshufps_avx(auVar117,auVar117,0x55);
    auVar179 = vshufps_avx(auVar257,auVar257,0);
    auVar96 = vshufps_avx(auVar257,auVar257,0x55);
    auVar151 = vshufps_avx(auVar173,auVar173,0);
    auVar19 = vshufps_avx(auVar173,auVar173,0x55);
    auVar122 = ZEXT416((uint)((auVar122._0_4_ - local_1d8._0_4_) * 0.04761905));
    auVar122 = vshufps_avx(auVar122,auVar122,0);
    auVar295._0_4_ = auVar171._0_4_ + auVar99._0_4_ * 0.0;
    auVar295._4_4_ = auVar171._4_4_ + auVar99._4_4_ * 0.14285715;
    auVar295._8_4_ = auVar171._8_4_ + auVar99._8_4_ * 0.2857143;
    auVar295._12_4_ = auVar171._12_4_ + auVar99._12_4_ * 0.42857146;
    auVar295._16_4_ = auVar171._0_4_ + auVar99._16_4_ * 0.5714286;
    auVar295._20_4_ = auVar171._4_4_ + auVar99._20_4_ * 0.71428573;
    auVar295._24_4_ = auVar171._8_4_ + auVar99._24_4_ * 0.8571429;
    auVar295._28_4_ = auVar171._12_4_ + auVar99._28_4_;
    auVar23 = vsubps_avx(auVar347,auVar295);
    fVar235 = auVar147._0_4_;
    fVar214 = auVar147._4_4_;
    fVar106 = auVar147._8_4_;
    fVar134 = auVar147._12_4_;
    fVar136 = auVar23._0_4_;
    fVar187 = auVar23._4_4_;
    fVar211 = auVar23._8_4_;
    fVar234 = auVar23._12_4_;
    fVar349 = auVar18._12_4_;
    fVar78 = auVar23._16_4_;
    fVar103 = auVar23._20_4_;
    fVar104 = auVar23._24_4_;
    fVar298 = auVar121._0_4_;
    fVar315 = auVar121._4_4_;
    fVar319 = auVar121._8_4_;
    fVar308 = auVar121._12_4_;
    local_3c8._0_4_ = auVar232._0_4_;
    local_3c8._4_4_ = auVar232._4_4_;
    fStack_3c0 = auVar232._8_4_;
    fStack_3bc = auVar232._12_4_;
    fVar161 = auVar179._0_4_;
    fVar163 = auVar179._4_4_;
    fVar189 = auVar179._8_4_;
    fVar212 = auVar179._12_4_;
    fVar236 = auVar295._0_4_ * fVar161 + fVar235 * fVar136;
    fVar105 = auVar295._4_4_ * fVar163 + fVar214 * fVar187;
    fVar133 = auVar295._8_4_ * fVar189 + fVar106 * fVar211;
    fVar135 = auVar295._12_4_ * fVar212 + fVar134 * fVar234;
    fVar284 = auVar295._16_4_ * fVar161 + fVar235 * fVar78;
    fVar296 = auVar295._20_4_ * fVar163 + fVar214 * fVar103;
    fVar297 = auVar295._24_4_ * fVar189 + fVar106 * fVar104;
    fVar162 = auVar96._0_4_;
    fVar188 = auVar96._4_4_;
    fVar190 = auVar96._8_4_;
    fVar213 = auVar96._12_4_;
    fVar307 = auVar295._0_4_ * fVar162 + fVar298 * fVar136;
    fVar317 = auVar295._4_4_ * fVar188 + fVar315 * fVar187;
    fVar325 = auVar295._8_4_ * fVar190 + fVar319 * fVar211;
    fVar331 = auVar295._12_4_ * fVar213 + fVar308 * fVar234;
    fVar332 = auVar295._16_4_ * fVar162 + fVar298 * fVar78;
    fVar333 = auVar295._20_4_ * fVar188 + fVar315 * fVar103;
    fVar316 = auVar295._24_4_ * fVar190 + fVar319 * fVar104;
    auVar171 = vshufps_avx(auVar150,auVar150,0xaa);
    auVar232 = vshufps_avx(auVar150,auVar150,0xff);
    fVar215 = fVar212 + 0.0;
    auVar147 = vshufps_avx(auVar117,auVar117,0xaa);
    auVar121 = vshufps_avx(auVar117,auVar117,0xff);
    auVar101._0_4_ =
         fVar136 * (fVar235 * auVar295._0_4_ + auVar18._0_4_ * fVar136) + auVar295._0_4_ * fVar236;
    auVar101._4_4_ =
         fVar187 * (fVar214 * auVar295._4_4_ + auVar18._4_4_ * fVar187) + auVar295._4_4_ * fVar105;
    auVar101._8_4_ =
         fVar211 * (fVar106 * auVar295._8_4_ + auVar18._8_4_ * fVar211) + auVar295._8_4_ * fVar133;
    auVar101._12_4_ =
         fVar234 * (fVar134 * auVar295._12_4_ + fVar349 * fVar234) + auVar295._12_4_ * fVar135;
    auVar101._16_4_ =
         fVar78 * (fVar235 * auVar295._16_4_ + auVar18._0_4_ * fVar78) + auVar295._16_4_ * fVar284;
    auVar101._20_4_ =
         fVar103 * (fVar214 * auVar295._20_4_ + auVar18._4_4_ * fVar103) + auVar295._20_4_ * fVar296
    ;
    auVar101._24_4_ =
         fVar104 * (fVar106 * auVar295._24_4_ + auVar18._8_4_ * fVar104) + auVar295._24_4_ * fVar297
    ;
    auVar101._28_4_ = fVar349 + 1.0 + fVar213;
    auVar183._0_4_ =
         fVar136 * (fVar298 * auVar295._0_4_ + fVar136 * (float)local_3c8._0_4_) +
         auVar295._0_4_ * fVar307;
    auVar183._4_4_ =
         fVar187 * (fVar315 * auVar295._4_4_ + fVar187 * (float)local_3c8._4_4_) +
         auVar295._4_4_ * fVar317;
    auVar183._8_4_ =
         fVar211 * (fVar319 * auVar295._8_4_ + fVar211 * fStack_3c0) + auVar295._8_4_ * fVar325;
    auVar183._12_4_ =
         fVar234 * (fVar308 * auVar295._12_4_ + fVar234 * fStack_3bc) + auVar295._12_4_ * fVar331;
    auVar183._16_4_ =
         fVar78 * (fVar298 * auVar295._16_4_ + fVar78 * (float)local_3c8._0_4_) +
         auVar295._16_4_ * fVar332;
    auVar183._20_4_ =
         fVar103 * (fVar315 * auVar295._20_4_ + fVar103 * (float)local_3c8._4_4_) +
         auVar295._20_4_ * fVar333;
    auVar183._24_4_ =
         fVar104 * (fVar319 * auVar295._24_4_ + fVar104 * fStack_3c0) + auVar295._24_4_ * fVar316;
    auVar183._28_4_ = fVar349 + 1.0 + fVar213;
    auVar208._0_4_ =
         fVar136 * fVar236 + auVar295._0_4_ * (auVar151._0_4_ * auVar295._0_4_ + fVar136 * fVar161);
    auVar208._4_4_ =
         fVar187 * fVar105 + auVar295._4_4_ * (auVar151._4_4_ * auVar295._4_4_ + fVar187 * fVar163);
    auVar208._8_4_ =
         fVar211 * fVar133 + auVar295._8_4_ * (auVar151._8_4_ * auVar295._8_4_ + fVar211 * fVar189);
    auVar208._12_4_ =
         fVar234 * fVar135 +
         auVar295._12_4_ * (auVar151._12_4_ * auVar295._12_4_ + fVar234 * fVar212);
    auVar208._16_4_ =
         fVar78 * fVar284 + auVar295._16_4_ * (auVar151._0_4_ * auVar295._16_4_ + fVar78 * fVar161);
    auVar208._20_4_ =
         fVar103 * fVar296 +
         auVar295._20_4_ * (auVar151._4_4_ * auVar295._20_4_ + fVar103 * fVar163);
    auVar208._24_4_ =
         fVar104 * fVar297 +
         auVar295._24_4_ * (auVar151._8_4_ * auVar295._24_4_ + fVar104 * fVar189);
    auVar208._28_4_ = fVar213 + fVar215;
    auVar306._0_4_ =
         fVar136 * fVar307 + auVar295._0_4_ * (auVar19._0_4_ * auVar295._0_4_ + fVar136 * fVar162);
    auVar306._4_4_ =
         fVar187 * fVar317 + auVar295._4_4_ * (auVar19._4_4_ * auVar295._4_4_ + fVar187 * fVar188);
    auVar306._8_4_ =
         fVar211 * fVar325 + auVar295._8_4_ * (auVar19._8_4_ * auVar295._8_4_ + fVar211 * fVar190);
    auVar306._12_4_ =
         fVar234 * fVar331 +
         auVar295._12_4_ * (auVar19._12_4_ * auVar295._12_4_ + fVar234 * fVar213);
    auVar306._16_4_ =
         fVar78 * fVar332 + auVar295._16_4_ * (auVar19._0_4_ * auVar295._16_4_ + fVar78 * fVar162);
    auVar306._20_4_ =
         fVar103 * fVar333 + auVar295._20_4_ * (auVar19._4_4_ * auVar295._20_4_ + fVar103 * fVar188)
    ;
    auVar306._24_4_ =
         fVar104 * fVar316 + auVar295._24_4_ * (auVar19._8_4_ * auVar295._24_4_ + fVar104 * fVar190)
    ;
    auVar306._28_4_ = fVar215 + fVar213 + 0.0;
    local_78._0_4_ = fVar136 * auVar101._0_4_ + auVar295._0_4_ * auVar208._0_4_;
    local_78._4_4_ = fVar187 * auVar101._4_4_ + auVar295._4_4_ * auVar208._4_4_;
    local_78._8_4_ = fVar211 * auVar101._8_4_ + auVar295._8_4_ * auVar208._8_4_;
    local_78._12_4_ = fVar234 * auVar101._12_4_ + auVar295._12_4_ * auVar208._12_4_;
    local_78._16_4_ = fVar78 * auVar101._16_4_ + auVar295._16_4_ * auVar208._16_4_;
    local_78._20_4_ = fVar103 * auVar101._20_4_ + auVar295._20_4_ * auVar208._20_4_;
    local_78._24_4_ = fVar104 * auVar101._24_4_ + auVar295._24_4_ * auVar208._24_4_;
    local_78._28_4_ = fVar349 + fVar134 + fVar213 + 0.0;
    local_98._0_4_ = fVar136 * auVar183._0_4_ + auVar295._0_4_ * auVar306._0_4_;
    local_98._4_4_ = fVar187 * auVar183._4_4_ + auVar295._4_4_ * auVar306._4_4_;
    local_98._8_4_ = fVar211 * auVar183._8_4_ + auVar295._8_4_ * auVar306._8_4_;
    local_98._12_4_ = fVar234 * auVar183._12_4_ + auVar295._12_4_ * auVar306._12_4_;
    local_98._16_4_ = fVar78 * auVar183._16_4_ + auVar295._16_4_ * auVar306._16_4_;
    local_98._20_4_ = fVar103 * auVar183._20_4_ + auVar295._20_4_ * auVar306._20_4_;
    local_98._24_4_ = fVar104 * auVar183._24_4_ + auVar295._24_4_ * auVar306._24_4_;
    local_98._28_4_ = fVar349 + fVar134 + fVar215;
    auVar24 = vsubps_avx(auVar208,auVar101);
    auVar99 = vsubps_avx(auVar306,auVar183);
    local_458._0_4_ = auVar122._0_4_;
    local_458._4_4_ = auVar122._4_4_;
    fStack_450 = auVar122._8_4_;
    fStack_44c = auVar122._12_4_;
    local_d8 = (float)local_458._0_4_ * auVar24._0_4_ * 3.0;
    fStack_d4 = (float)local_458._4_4_ * auVar24._4_4_ * 3.0;
    auVar25._4_4_ = fStack_d4;
    auVar25._0_4_ = local_d8;
    fStack_d0 = fStack_450 * auVar24._8_4_ * 3.0;
    auVar25._8_4_ = fStack_d0;
    fStack_cc = fStack_44c * auVar24._12_4_ * 3.0;
    auVar25._12_4_ = fStack_cc;
    fStack_c8 = (float)local_458._0_4_ * auVar24._16_4_ * 3.0;
    auVar25._16_4_ = fStack_c8;
    fStack_c4 = (float)local_458._4_4_ * auVar24._20_4_ * 3.0;
    auVar25._20_4_ = fStack_c4;
    fStack_c0 = fStack_450 * auVar24._24_4_ * 3.0;
    auVar25._24_4_ = fStack_c0;
    auVar25._28_4_ = auVar24._28_4_;
    fVar105 = (float)local_458._0_4_ * auVar99._0_4_ * 3.0;
    fVar106 = (float)local_458._4_4_ * auVar99._4_4_ * 3.0;
    auVar26._4_4_ = fVar106;
    auVar26._0_4_ = fVar105;
    fVar133 = fStack_450 * auVar99._8_4_ * 3.0;
    auVar26._8_4_ = fVar133;
    fVar134 = fStack_44c * auVar99._12_4_ * 3.0;
    auVar26._12_4_ = fVar134;
    fVar135 = (float)local_458._0_4_ * auVar99._16_4_ * 3.0;
    auVar26._16_4_ = fVar135;
    fVar284 = (float)local_458._4_4_ * auVar99._20_4_ * 3.0;
    auVar26._20_4_ = fVar284;
    fVar296 = fStack_450 * auVar99._24_4_ * 3.0;
    auVar26._24_4_ = fVar296;
    auVar26._28_4_ = auVar208._28_4_;
    auVar25 = vsubps_avx(local_78,auVar25);
    auVar99 = vperm2f128_avx(auVar25,auVar25,1);
    auVar99 = vshufps_avx(auVar99,auVar25,0x30);
    _local_3c8 = vshufps_avx(auVar25,auVar99,0x29);
    auVar25 = vsubps_avx(local_98,auVar26);
    auVar99 = vperm2f128_avx(auVar25,auVar25,1);
    auVar99 = vshufps_avx(auVar99,auVar25,0x30);
    _local_438 = vshufps_avx(auVar25,auVar99,0x29);
    fVar351 = auVar147._0_4_;
    fVar340 = auVar147._4_4_;
    fVar341 = auVar147._8_4_;
    fVar161 = auVar121._0_4_;
    fVar188 = auVar121._4_4_;
    fVar212 = auVar121._8_4_;
    fVar235 = auVar121._12_4_;
    fVar350 = auVar232._12_4_;
    auVar122 = vshufps_avx(auVar257,auVar257,0xaa);
    fVar162 = auVar122._0_4_;
    fVar189 = auVar122._4_4_;
    fVar213 = auVar122._8_4_;
    fVar236 = auVar122._12_4_;
    fVar331 = auVar295._0_4_ * fVar162 + fVar351 * fVar136;
    fVar332 = auVar295._4_4_ * fVar189 + fVar340 * fVar187;
    fVar333 = auVar295._8_4_ * fVar213 + fVar341 * fVar211;
    fVar316 = auVar295._12_4_ * fVar236 + auVar147._12_4_ * fVar234;
    fVar318 = auVar295._16_4_ * fVar162 + fVar351 * fVar78;
    fVar320 = auVar295._20_4_ * fVar189 + fVar340 * fVar103;
    fVar342 = auVar295._24_4_ * fVar213 + fVar341 * fVar104;
    fVar308 = fVar350 + fVar349 + fVar308;
    auVar122 = vshufps_avx(auVar257,auVar257,0xff);
    fVar163 = auVar122._0_4_;
    fVar190 = auVar122._4_4_;
    fVar215 = auVar122._8_4_;
    fVar214 = auVar122._12_4_;
    fVar297 = auVar295._0_4_ * fVar163 + fVar136 * fVar161;
    fVar298 = auVar295._4_4_ * fVar190 + fVar187 * fVar188;
    fVar307 = auVar295._8_4_ * fVar215 + fVar211 * fVar212;
    fVar315 = auVar295._12_4_ * fVar214 + fVar234 * fVar235;
    fVar317 = auVar295._16_4_ * fVar163 + fVar78 * fVar161;
    fVar319 = auVar295._20_4_ * fVar190 + fVar103 * fVar188;
    fVar325 = auVar295._24_4_ * fVar215 + fVar104 * fVar212;
    auVar122 = vshufps_avx(auVar173,auVar173,0xaa);
    auVar18 = vshufps_avx(auVar173,auVar173,0xff);
    fVar349 = auVar18._12_4_;
    auVar102._0_4_ =
         auVar295._0_4_ * fVar331 + fVar136 * (fVar351 * auVar295._0_4_ + auVar171._0_4_ * fVar136);
    auVar102._4_4_ =
         auVar295._4_4_ * fVar332 + fVar187 * (fVar340 * auVar295._4_4_ + auVar171._4_4_ * fVar187);
    auVar102._8_4_ =
         auVar295._8_4_ * fVar333 + fVar211 * (fVar341 * auVar295._8_4_ + auVar171._8_4_ * fVar211);
    auVar102._12_4_ =
         auVar295._12_4_ * fVar316 +
         fVar234 * (auVar147._12_4_ * auVar295._12_4_ + auVar171._12_4_ * fVar234);
    auVar102._16_4_ =
         auVar295._16_4_ * fVar318 + fVar78 * (fVar351 * auVar295._16_4_ + auVar171._0_4_ * fVar78);
    auVar102._20_4_ =
         auVar295._20_4_ * fVar320 +
         fVar103 * (fVar340 * auVar295._20_4_ + auVar171._4_4_ * fVar103);
    auVar102._24_4_ =
         auVar295._24_4_ * fVar342 +
         fVar104 * (fVar341 * auVar295._24_4_ + auVar171._8_4_ * fVar104);
    auVar102._28_4_ = fVar349 + auVar25._28_4_ + auVar99._28_4_;
    auVar330._0_4_ =
         auVar295._0_4_ * fVar297 + fVar136 * (auVar295._0_4_ * fVar161 + auVar232._0_4_ * fVar136);
    auVar330._4_4_ =
         auVar295._4_4_ * fVar298 + fVar187 * (auVar295._4_4_ * fVar188 + auVar232._4_4_ * fVar187);
    auVar330._8_4_ =
         auVar295._8_4_ * fVar307 + fVar211 * (auVar295._8_4_ * fVar212 + auVar232._8_4_ * fVar211);
    auVar330._12_4_ =
         auVar295._12_4_ * fVar315 + fVar234 * (auVar295._12_4_ * fVar235 + fVar350 * fVar234);
    auVar330._16_4_ =
         auVar295._16_4_ * fVar317 + fVar78 * (auVar295._16_4_ * fVar161 + auVar232._0_4_ * fVar78);
    auVar330._20_4_ =
         auVar295._20_4_ * fVar319 +
         fVar103 * (auVar295._20_4_ * fVar188 + auVar232._4_4_ * fVar103);
    auVar330._24_4_ =
         auVar295._24_4_ * fVar325 +
         fVar104 * (auVar295._24_4_ * fVar212 + auVar232._8_4_ * fVar104);
    auVar330._28_4_ = fVar349 + auVar99._28_4_ + auVar208._28_4_;
    auVar99 = vperm2f128_avx(local_78,local_78,1);
    auVar99 = vshufps_avx(auVar99,local_78,0x30);
    _local_3a8 = vshufps_avx(local_78,auVar99,0x29);
    auVar209._0_4_ =
         fVar136 * fVar331 + auVar295._0_4_ * (auVar122._0_4_ * auVar295._0_4_ + fVar136 * fVar162);
    auVar209._4_4_ =
         fVar187 * fVar332 + auVar295._4_4_ * (auVar122._4_4_ * auVar295._4_4_ + fVar187 * fVar189);
    auVar209._8_4_ =
         fVar211 * fVar333 + auVar295._8_4_ * (auVar122._8_4_ * auVar295._8_4_ + fVar211 * fVar213);
    auVar209._12_4_ =
         fVar234 * fVar316 +
         auVar295._12_4_ * (auVar122._12_4_ * auVar295._12_4_ + fVar234 * fVar236);
    auVar209._16_4_ =
         fVar78 * fVar318 + auVar295._16_4_ * (auVar122._0_4_ * auVar295._16_4_ + fVar78 * fVar162);
    auVar209._20_4_ =
         fVar103 * fVar320 +
         auVar295._20_4_ * (auVar122._4_4_ * auVar295._20_4_ + fVar103 * fVar189);
    auVar209._24_4_ =
         fVar104 * fVar342 +
         auVar295._24_4_ * (auVar122._8_4_ * auVar295._24_4_ + fVar104 * fVar213);
    auVar209._28_4_ = fVar308 + auVar122._12_4_ + fVar236;
    auVar247._0_4_ =
         fVar136 * fVar297 + auVar295._0_4_ * (auVar18._0_4_ * auVar295._0_4_ + fVar136 * fVar163);
    auVar247._4_4_ =
         fVar187 * fVar298 + auVar295._4_4_ * (auVar18._4_4_ * auVar295._4_4_ + fVar187 * fVar190);
    auVar247._8_4_ =
         fVar211 * fVar307 + auVar295._8_4_ * (auVar18._8_4_ * auVar295._8_4_ + fVar211 * fVar215);
    auVar247._12_4_ =
         fVar234 * fVar315 + auVar295._12_4_ * (fVar349 * auVar295._12_4_ + fVar234 * fVar214);
    auVar247._16_4_ =
         fVar78 * fVar317 + auVar295._16_4_ * (auVar18._0_4_ * auVar295._16_4_ + fVar78 * fVar163);
    auVar247._20_4_ =
         fVar103 * fVar319 + auVar295._20_4_ * (auVar18._4_4_ * auVar295._20_4_ + fVar103 * fVar190)
    ;
    auVar247._24_4_ =
         fVar104 * fVar325 + auVar295._24_4_ * (auVar18._8_4_ * auVar295._24_4_ + fVar104 * fVar215)
    ;
    auVar247._28_4_ = fVar350 + fVar235 + fVar349 + fVar214;
    auVar262._0_4_ = fVar136 * auVar102._0_4_ + auVar295._0_4_ * auVar209._0_4_;
    auVar262._4_4_ = fVar187 * auVar102._4_4_ + auVar295._4_4_ * auVar209._4_4_;
    auVar262._8_4_ = fVar211 * auVar102._8_4_ + auVar295._8_4_ * auVar209._8_4_;
    auVar262._12_4_ = fVar234 * auVar102._12_4_ + auVar295._12_4_ * auVar209._12_4_;
    auVar262._16_4_ = fVar78 * auVar102._16_4_ + auVar295._16_4_ * auVar209._16_4_;
    auVar262._20_4_ = fVar103 * auVar102._20_4_ + auVar295._20_4_ * auVar209._20_4_;
    auVar262._24_4_ = fVar104 * auVar102._24_4_ + auVar295._24_4_ * auVar209._24_4_;
    auVar262._28_4_ = fVar308 + fVar349 + fVar214;
    auVar283._0_4_ = fVar136 * auVar330._0_4_ + auVar295._0_4_ * auVar247._0_4_;
    auVar283._4_4_ = fVar187 * auVar330._4_4_ + auVar295._4_4_ * auVar247._4_4_;
    auVar283._8_4_ = fVar211 * auVar330._8_4_ + auVar295._8_4_ * auVar247._8_4_;
    auVar283._12_4_ = fVar234 * auVar330._12_4_ + auVar295._12_4_ * auVar247._12_4_;
    auVar283._16_4_ = fVar78 * auVar330._16_4_ + auVar295._16_4_ * auVar247._16_4_;
    auVar283._20_4_ = fVar103 * auVar330._20_4_ + auVar295._20_4_ * auVar247._20_4_;
    auVar283._24_4_ = fVar104 * auVar330._24_4_ + auVar295._24_4_ * auVar247._24_4_;
    auVar283._28_4_ = auVar23._28_4_ + auVar295._28_4_;
    auVar99 = vsubps_avx(auVar209,auVar102);
    auVar23 = vsubps_avx(auVar247,auVar330);
    local_f8 = (float)local_458._0_4_ * auVar99._0_4_ * 3.0;
    fStack_f4 = (float)local_458._4_4_ * auVar99._4_4_ * 3.0;
    auVar21._4_4_ = fStack_f4;
    auVar21._0_4_ = local_f8;
    fStack_f0 = fStack_450 * auVar99._8_4_ * 3.0;
    auVar21._8_4_ = fStack_f0;
    fStack_ec = fStack_44c * auVar99._12_4_ * 3.0;
    auVar21._12_4_ = fStack_ec;
    fStack_e8 = (float)local_458._0_4_ * auVar99._16_4_ * 3.0;
    auVar21._16_4_ = fStack_e8;
    fStack_e4 = (float)local_458._4_4_ * auVar99._20_4_ * 3.0;
    auVar21._20_4_ = fStack_e4;
    fStack_e0 = fStack_450 * auVar99._24_4_ * 3.0;
    auVar21._24_4_ = fStack_e0;
    auVar21._28_4_ = auVar247._28_4_;
    local_118 = (float)local_458._0_4_ * auVar23._0_4_ * 3.0;
    fStack_114 = (float)local_458._4_4_ * auVar23._4_4_ * 3.0;
    auVar22._4_4_ = fStack_114;
    auVar22._0_4_ = local_118;
    fStack_110 = fStack_450 * auVar23._8_4_ * 3.0;
    auVar22._8_4_ = fStack_110;
    fStack_10c = fStack_44c * auVar23._12_4_ * 3.0;
    auVar22._12_4_ = fStack_10c;
    local_458._0_4_ = (float)local_458._0_4_ * auVar23._16_4_ * 3.0;
    auVar22._16_4_ = local_458._0_4_;
    local_458._4_4_ = (float)local_458._4_4_ * auVar23._20_4_ * 3.0;
    auVar22._20_4_ = local_458._4_4_;
    fStack_450 = fStack_450 * auVar23._24_4_ * 3.0;
    auVar22._24_4_ = fStack_450;
    auVar22._28_4_ = fStack_44c;
    auVar99 = vperm2f128_avx(auVar262,auVar262,1);
    auVar99 = vshufps_avx(auVar99,auVar262,0x30);
    auVar100 = vshufps_avx(auVar262,auVar99,0x29);
    auVar23 = vsubps_avx(auVar262,auVar21);
    auVar99 = vperm2f128_avx(auVar23,auVar23,1);
    auVar99 = vshufps_avx(auVar99,auVar23,0x30);
    auVar21 = vshufps_avx(auVar23,auVar99,0x29);
    auVar23 = vsubps_avx(auVar283,auVar22);
    auVar99 = vperm2f128_avx(auVar23,auVar23,1);
    auVar99 = vshufps_avx(auVar99,auVar23,0x30);
    auVar22 = vshufps_avx(auVar23,auVar99,0x29);
    auVar25 = vsubps_avx(auVar262,local_78);
    auVar26 = vsubps_avx(auVar100,_local_3a8);
    fVar136 = auVar26._0_4_ + auVar25._0_4_;
    fVar161 = auVar26._4_4_ + auVar25._4_4_;
    fVar162 = auVar26._8_4_ + auVar25._8_4_;
    fVar163 = auVar26._12_4_ + auVar25._12_4_;
    fVar187 = auVar26._16_4_ + auVar25._16_4_;
    fVar188 = auVar26._20_4_ + auVar25._20_4_;
    fVar189 = auVar26._24_4_ + auVar25._24_4_;
    auVar23 = vperm2f128_avx(local_98,local_98,1);
    auVar23 = vshufps_avx(auVar23,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar23,0x29);
    auVar23 = vperm2f128_avx(auVar283,auVar283,1);
    auVar23 = vshufps_avx(auVar23,auVar283,0x30);
    auVar101 = vshufps_avx(auVar283,auVar23,0x29);
    auVar23 = vsubps_avx(auVar283,local_98);
    auVar102 = vsubps_avx(auVar101,local_b8);
    fVar190 = auVar23._0_4_ + auVar102._0_4_;
    fVar211 = auVar23._4_4_ + auVar102._4_4_;
    fVar212 = auVar23._8_4_ + auVar102._8_4_;
    fVar213 = auVar23._12_4_ + auVar102._12_4_;
    fVar215 = auVar23._16_4_ + auVar102._16_4_;
    fVar234 = auVar23._20_4_ + auVar102._20_4_;
    fVar235 = auVar23._24_4_ + auVar102._24_4_;
    fVar236 = auVar23._28_4_;
    auVar23._4_4_ = local_98._4_4_ * fVar161;
    auVar23._0_4_ = local_98._0_4_ * fVar136;
    auVar23._8_4_ = local_98._8_4_ * fVar162;
    auVar23._12_4_ = local_98._12_4_ * fVar163;
    auVar23._16_4_ = local_98._16_4_ * fVar187;
    auVar23._20_4_ = local_98._20_4_ * fVar188;
    auVar23._24_4_ = local_98._24_4_ * fVar189;
    auVar23._28_4_ = fVar236;
    auVar27._4_4_ = fVar211 * local_78._4_4_;
    auVar27._0_4_ = fVar190 * local_78._0_4_;
    auVar27._8_4_ = fVar212 * local_78._8_4_;
    auVar27._12_4_ = fVar213 * local_78._12_4_;
    auVar27._16_4_ = fVar215 * local_78._16_4_;
    auVar27._20_4_ = fVar234 * local_78._20_4_;
    auVar27._24_4_ = fVar235 * local_78._24_4_;
    auVar27._28_4_ = auVar99._28_4_;
    auVar99 = vsubps_avx(auVar23,auVar27);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar24._28_4_;
    fVar105 = local_98._0_4_ + fVar105;
    fVar106 = local_98._4_4_ + fVar106;
    fVar133 = local_98._8_4_ + fVar133;
    fVar134 = local_98._12_4_ + fVar134;
    fVar135 = local_98._16_4_ + fVar135;
    fVar284 = local_98._20_4_ + fVar284;
    fVar296 = local_98._24_4_ + fVar296;
    auVar24._4_4_ = fVar106 * fVar161;
    auVar24._0_4_ = fVar105 * fVar136;
    auVar24._8_4_ = fVar133 * fVar162;
    auVar24._12_4_ = fVar134 * fVar163;
    auVar24._16_4_ = fVar135 * fVar187;
    auVar24._20_4_ = fVar284 * fVar188;
    auVar24._24_4_ = fVar296 * fVar189;
    auVar24._28_4_ = fVar236;
    auVar28._4_4_ = fVar211 * fStack_d4;
    auVar28._0_4_ = fVar190 * local_d8;
    auVar28._8_4_ = fVar212 * fStack_d0;
    auVar28._12_4_ = fVar213 * fStack_cc;
    auVar28._16_4_ = fVar215 * fStack_c8;
    auVar28._20_4_ = fVar234 * fStack_c4;
    auVar28._24_4_ = fVar235 * fStack_c0;
    auVar28._28_4_ = fStack_bc;
    auVar24 = vsubps_avx(auVar24,auVar28);
    auVar29._4_4_ = local_438._4_4_ * fVar161;
    auVar29._0_4_ = local_438._0_4_ * fVar136;
    auVar29._8_4_ = local_438._8_4_ * fVar162;
    auVar29._12_4_ = local_438._12_4_ * fVar163;
    auVar29._16_4_ = local_438._16_4_ * fVar187;
    auVar29._20_4_ = local_438._20_4_ * fVar188;
    auVar29._24_4_ = local_438._24_4_ * fVar189;
    auVar29._28_4_ = fVar236;
    auVar30._4_4_ = fVar211 * (float)local_3c8._4_4_;
    auVar30._0_4_ = fVar190 * (float)local_3c8._0_4_;
    auVar30._8_4_ = fVar212 * fStack_3c0;
    auVar30._12_4_ = fVar213 * fStack_3bc;
    auVar30._16_4_ = fVar215 * fStack_3b8;
    auVar30._20_4_ = fVar234 * fStack_3b4;
    auVar30._24_4_ = fVar235 * fStack_3b0;
    auVar30._28_4_ = 0x40400000;
    auVar27 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = local_b8._4_4_ * fVar161;
    auVar31._0_4_ = local_b8._0_4_ * fVar136;
    auVar31._8_4_ = local_b8._8_4_ * fVar162;
    auVar31._12_4_ = local_b8._12_4_ * fVar163;
    auVar31._16_4_ = local_b8._16_4_ * fVar187;
    auVar31._20_4_ = local_b8._20_4_ * fVar188;
    auVar31._24_4_ = local_b8._24_4_ * fVar189;
    auVar31._28_4_ = fVar236;
    auVar32._4_4_ = local_3a8._4_4_ * fVar211;
    auVar32._0_4_ = local_3a8._0_4_ * fVar190;
    auVar32._8_4_ = local_3a8._8_4_ * fVar212;
    auVar32._12_4_ = local_3a8._12_4_ * fVar213;
    auVar32._16_4_ = local_3a8._16_4_ * fVar215;
    auVar32._20_4_ = local_3a8._20_4_ * fVar234;
    auVar32._24_4_ = local_3a8._24_4_ * fVar235;
    auVar32._28_4_ = local_b8._28_4_;
    auVar28 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar283._4_4_ * fVar161;
    auVar33._0_4_ = auVar283._0_4_ * fVar136;
    auVar33._8_4_ = auVar283._8_4_ * fVar162;
    auVar33._12_4_ = auVar283._12_4_ * fVar163;
    auVar33._16_4_ = auVar283._16_4_ * fVar187;
    auVar33._20_4_ = auVar283._20_4_ * fVar188;
    auVar33._24_4_ = auVar283._24_4_ * fVar189;
    auVar33._28_4_ = fVar236;
    auVar34._4_4_ = fVar211 * auVar262._4_4_;
    auVar34._0_4_ = fVar190 * auVar262._0_4_;
    auVar34._8_4_ = fVar212 * auVar262._8_4_;
    auVar34._12_4_ = fVar213 * auVar262._12_4_;
    auVar34._16_4_ = fVar215 * auVar262._16_4_;
    auVar34._20_4_ = fVar234 * auVar262._20_4_;
    auVar34._24_4_ = fVar235 * auVar262._24_4_;
    auVar34._28_4_ = local_438._28_4_;
    auVar29 = vsubps_avx(auVar33,auVar34);
    local_f8 = auVar262._0_4_ + local_f8;
    fStack_f4 = auVar262._4_4_ + fStack_f4;
    fStack_f0 = auVar262._8_4_ + fStack_f0;
    fStack_ec = auVar262._12_4_ + fStack_ec;
    fStack_e8 = auVar262._16_4_ + fStack_e8;
    fStack_e4 = auVar262._20_4_ + fStack_e4;
    fStack_e0 = auVar262._24_4_ + fStack_e0;
    fStack_dc = auVar262._28_4_ + auVar247._28_4_;
    local_118 = auVar283._0_4_ + local_118;
    fStack_114 = auVar283._4_4_ + fStack_114;
    fStack_110 = auVar283._8_4_ + fStack_110;
    fStack_10c = auVar283._12_4_ + fStack_10c;
    fStack_108 = auVar283._16_4_ + (float)local_458._0_4_;
    fStack_104 = auVar283._20_4_ + (float)local_458._4_4_;
    fStack_100 = auVar283._24_4_ + fStack_450;
    fStack_fc = auVar283._28_4_ + fStack_44c;
    auVar35._4_4_ = fStack_114 * fVar161;
    auVar35._0_4_ = local_118 * fVar136;
    auVar35._8_4_ = fStack_110 * fVar162;
    auVar35._12_4_ = fStack_10c * fVar163;
    auVar35._16_4_ = fStack_108 * fVar187;
    auVar35._20_4_ = fStack_104 * fVar188;
    auVar35._24_4_ = fStack_100 * fVar189;
    auVar35._28_4_ = auVar283._28_4_ + fStack_44c;
    auVar36._4_4_ = fStack_f4 * fVar211;
    auVar36._0_4_ = local_f8 * fVar190;
    auVar36._8_4_ = fStack_f0 * fVar212;
    auVar36._12_4_ = fStack_ec * fVar213;
    auVar36._16_4_ = fStack_e8 * fVar215;
    auVar36._20_4_ = fStack_e4 * fVar234;
    auVar36._24_4_ = fStack_e0 * fVar235;
    auVar36._28_4_ = fStack_dc;
    auVar30 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar22._4_4_ * fVar161;
    auVar37._0_4_ = auVar22._0_4_ * fVar136;
    auVar37._8_4_ = auVar22._8_4_ * fVar162;
    auVar37._12_4_ = auVar22._12_4_ * fVar163;
    auVar37._16_4_ = auVar22._16_4_ * fVar187;
    auVar37._20_4_ = auVar22._20_4_ * fVar188;
    auVar37._24_4_ = auVar22._24_4_ * fVar189;
    auVar37._28_4_ = fStack_dc;
    auVar38._4_4_ = fVar211 * auVar21._4_4_;
    auVar38._0_4_ = fVar190 * auVar21._0_4_;
    auVar38._8_4_ = fVar212 * auVar21._8_4_;
    auVar38._12_4_ = fVar213 * auVar21._12_4_;
    auVar38._16_4_ = fVar215 * auVar21._16_4_;
    auVar38._20_4_ = fVar234 * auVar21._20_4_;
    auVar38._24_4_ = fVar235 * auVar21._24_4_;
    auVar38._28_4_ = auVar21._28_4_;
    auVar31 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = auVar101._4_4_ * fVar161;
    auVar39._0_4_ = auVar101._0_4_ * fVar136;
    auVar39._8_4_ = auVar101._8_4_ * fVar162;
    auVar39._12_4_ = auVar101._12_4_ * fVar163;
    auVar39._16_4_ = auVar101._16_4_ * fVar187;
    auVar39._20_4_ = auVar101._20_4_ * fVar188;
    auVar39._24_4_ = auVar101._24_4_ * fVar189;
    auVar39._28_4_ = auVar26._28_4_ + auVar25._28_4_;
    auVar40._4_4_ = auVar100._4_4_ * fVar211;
    auVar40._0_4_ = auVar100._0_4_ * fVar190;
    auVar40._8_4_ = auVar100._8_4_ * fVar212;
    auVar40._12_4_ = auVar100._12_4_ * fVar213;
    auVar40._16_4_ = auVar100._16_4_ * fVar215;
    auVar40._20_4_ = auVar100._20_4_ * fVar234;
    auVar40._24_4_ = auVar100._24_4_ * fVar235;
    auVar40._28_4_ = fVar236 + auVar102._28_4_;
    auVar102 = vsubps_avx(auVar39,auVar40);
    auVar23 = vminps_avx(auVar99,auVar24);
    auVar99 = vmaxps_avx(auVar99,auVar24);
    auVar24 = vminps_avx(auVar27,auVar28);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar27,auVar28);
    auVar99 = vmaxps_avx(auVar99,auVar23);
    auVar25 = vminps_avx(auVar29,auVar30);
    auVar23 = vmaxps_avx(auVar29,auVar30);
    auVar26 = vminps_avx(auVar31,auVar102);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar31,auVar102);
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar99,auVar23);
    auVar99 = vcmpps_avx(auVar25,local_138,2);
    auVar23 = vcmpps_avx(auVar23,local_158,5);
    auVar99 = vandps_avx(auVar23,auVar99);
    auVar23 = local_198 & auVar99;
    uVar69 = 0;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(_local_3a8,local_78);
      auVar24 = vsubps_avx(auVar100,auVar262);
      fVar161 = auVar23._0_4_ + auVar24._0_4_;
      fVar162 = auVar23._4_4_ + auVar24._4_4_;
      fVar163 = auVar23._8_4_ + auVar24._8_4_;
      fVar187 = auVar23._12_4_ + auVar24._12_4_;
      fVar188 = auVar23._16_4_ + auVar24._16_4_;
      fVar189 = auVar23._20_4_ + auVar24._20_4_;
      fVar190 = auVar23._24_4_ + auVar24._24_4_;
      auVar25 = vsubps_avx(local_b8,local_98);
      auVar26 = vsubps_avx(auVar101,auVar283);
      fVar211 = auVar25._0_4_ + auVar26._0_4_;
      fVar212 = auVar25._4_4_ + auVar26._4_4_;
      fVar213 = auVar25._8_4_ + auVar26._8_4_;
      fVar215 = auVar25._12_4_ + auVar26._12_4_;
      fVar234 = auVar25._16_4_ + auVar26._16_4_;
      fVar235 = auVar25._20_4_ + auVar26._20_4_;
      fVar236 = auVar25._24_4_ + auVar26._24_4_;
      fVar136 = auVar26._28_4_;
      auVar41._4_4_ = local_98._4_4_ * fVar162;
      auVar41._0_4_ = local_98._0_4_ * fVar161;
      auVar41._8_4_ = local_98._8_4_ * fVar163;
      auVar41._12_4_ = local_98._12_4_ * fVar187;
      auVar41._16_4_ = local_98._16_4_ * fVar188;
      auVar41._20_4_ = local_98._20_4_ * fVar189;
      auVar41._24_4_ = local_98._24_4_ * fVar190;
      auVar41._28_4_ = local_98._28_4_;
      auVar42._4_4_ = local_78._4_4_ * fVar212;
      auVar42._0_4_ = local_78._0_4_ * fVar211;
      auVar42._8_4_ = local_78._8_4_ * fVar213;
      auVar42._12_4_ = local_78._12_4_ * fVar215;
      auVar42._16_4_ = local_78._16_4_ * fVar234;
      auVar42._20_4_ = local_78._20_4_ * fVar235;
      auVar42._24_4_ = local_78._24_4_ * fVar236;
      auVar42._28_4_ = local_78._28_4_;
      auVar26 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar106 * fVar162;
      auVar43._0_4_ = fVar105 * fVar161;
      auVar43._8_4_ = fVar133 * fVar163;
      auVar43._12_4_ = fVar134 * fVar187;
      auVar43._16_4_ = fVar135 * fVar188;
      auVar43._20_4_ = fVar284 * fVar189;
      auVar43._24_4_ = fVar296 * fVar190;
      auVar43._28_4_ = local_98._28_4_;
      auVar44._4_4_ = fVar212 * fStack_d4;
      auVar44._0_4_ = fVar211 * local_d8;
      auVar44._8_4_ = fVar213 * fStack_d0;
      auVar44._12_4_ = fVar215 * fStack_cc;
      auVar44._16_4_ = fVar234 * fStack_c8;
      auVar44._20_4_ = fVar235 * fStack_c4;
      auVar44._24_4_ = fVar236 * fStack_c0;
      auVar44._28_4_ = fVar136;
      auVar102 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar162 * local_438._4_4_;
      auVar45._0_4_ = fVar161 * local_438._0_4_;
      auVar45._8_4_ = fVar163 * local_438._8_4_;
      auVar45._12_4_ = fVar187 * local_438._12_4_;
      auVar45._16_4_ = fVar188 * local_438._16_4_;
      auVar45._20_4_ = fVar189 * local_438._20_4_;
      auVar45._24_4_ = fVar190 * local_438._24_4_;
      auVar45._28_4_ = fVar136;
      auVar46._4_4_ = fVar212 * (float)local_3c8._4_4_;
      auVar46._0_4_ = fVar211 * (float)local_3c8._0_4_;
      auVar46._8_4_ = fVar213 * fStack_3c0;
      auVar46._12_4_ = fVar215 * fStack_3bc;
      auVar46._16_4_ = fVar234 * fStack_3b8;
      auVar46._20_4_ = fVar235 * fStack_3b4;
      auVar46._24_4_ = fVar236 * fStack_3b0;
      auVar46._28_4_ = local_98._28_4_ + auVar208._28_4_;
      auVar27 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_b8._4_4_ * fVar162;
      auVar47._0_4_ = local_b8._0_4_ * fVar161;
      auVar47._8_4_ = local_b8._8_4_ * fVar163;
      auVar47._12_4_ = local_b8._12_4_ * fVar187;
      auVar47._16_4_ = local_b8._16_4_ * fVar188;
      auVar47._20_4_ = local_b8._20_4_ * fVar189;
      auVar47._24_4_ = local_b8._24_4_ * fVar190;
      auVar47._28_4_ = local_98._28_4_ + auVar208._28_4_;
      auVar48._4_4_ = local_3a8._4_4_ * fVar212;
      auVar48._0_4_ = local_3a8._0_4_ * fVar211;
      auVar48._8_4_ = local_3a8._8_4_ * fVar213;
      auVar48._12_4_ = local_3a8._12_4_ * fVar215;
      auVar48._16_4_ = local_3a8._16_4_ * fVar234;
      auVar48._20_4_ = local_3a8._20_4_ * fVar235;
      uVar8 = local_3a8._28_4_;
      auVar48._24_4_ = local_3a8._24_4_ * fVar236;
      auVar48._28_4_ = uVar8;
      auVar28 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar283._4_4_ * fVar162;
      auVar49._0_4_ = auVar283._0_4_ * fVar161;
      auVar49._8_4_ = auVar283._8_4_ * fVar163;
      auVar49._12_4_ = auVar283._12_4_ * fVar187;
      auVar49._16_4_ = auVar283._16_4_ * fVar188;
      auVar49._20_4_ = auVar283._20_4_ * fVar189;
      auVar49._24_4_ = auVar283._24_4_ * fVar190;
      auVar49._28_4_ = auVar283._28_4_;
      auVar50._4_4_ = auVar262._4_4_ * fVar212;
      auVar50._0_4_ = auVar262._0_4_ * fVar211;
      auVar50._8_4_ = auVar262._8_4_ * fVar213;
      auVar50._12_4_ = auVar262._12_4_ * fVar215;
      auVar50._16_4_ = auVar262._16_4_ * fVar234;
      auVar50._20_4_ = auVar262._20_4_ * fVar235;
      auVar50._24_4_ = auVar262._24_4_ * fVar236;
      auVar50._28_4_ = auVar262._28_4_;
      auVar29 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar162 * fStack_114;
      auVar51._0_4_ = fVar161 * local_118;
      auVar51._8_4_ = fVar163 * fStack_110;
      auVar51._12_4_ = fVar187 * fStack_10c;
      auVar51._16_4_ = fVar188 * fStack_108;
      auVar51._20_4_ = fVar189 * fStack_104;
      auVar51._24_4_ = fVar190 * fStack_100;
      auVar51._28_4_ = auVar283._28_4_;
      auVar52._4_4_ = fVar212 * fStack_f4;
      auVar52._0_4_ = fVar211 * local_f8;
      auVar52._8_4_ = fVar213 * fStack_f0;
      auVar52._12_4_ = fVar215 * fStack_ec;
      auVar52._16_4_ = fVar234 * fStack_e8;
      auVar52._20_4_ = fVar235 * fStack_e4;
      auVar52._24_4_ = fVar236 * fStack_e0;
      auVar52._28_4_ = uVar8;
      auVar30 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar162 * auVar22._4_4_;
      auVar53._0_4_ = fVar161 * auVar22._0_4_;
      auVar53._8_4_ = fVar163 * auVar22._8_4_;
      auVar53._12_4_ = fVar187 * auVar22._12_4_;
      auVar53._16_4_ = fVar188 * auVar22._16_4_;
      auVar53._20_4_ = fVar189 * auVar22._20_4_;
      auVar53._24_4_ = fVar190 * auVar22._24_4_;
      auVar53._28_4_ = uVar8;
      auVar54._4_4_ = fVar212 * auVar21._4_4_;
      auVar54._0_4_ = fVar211 * auVar21._0_4_;
      auVar54._8_4_ = fVar213 * auVar21._8_4_;
      auVar54._12_4_ = fVar215 * auVar21._12_4_;
      auVar54._16_4_ = fVar234 * auVar21._16_4_;
      auVar54._20_4_ = fVar235 * auVar21._20_4_;
      auVar54._24_4_ = fVar236 * auVar21._24_4_;
      auVar54._28_4_ = local_b8._28_4_;
      auVar21 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = auVar101._4_4_ * fVar162;
      auVar55._0_4_ = auVar101._0_4_ * fVar161;
      auVar55._8_4_ = auVar101._8_4_ * fVar163;
      auVar55._12_4_ = auVar101._12_4_ * fVar187;
      auVar55._16_4_ = auVar101._16_4_ * fVar188;
      auVar55._20_4_ = auVar101._20_4_ * fVar189;
      auVar55._24_4_ = auVar101._24_4_ * fVar190;
      auVar55._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar56._4_4_ = auVar100._4_4_ * fVar212;
      auVar56._0_4_ = auVar100._0_4_ * fVar211;
      auVar56._8_4_ = auVar100._8_4_ * fVar213;
      auVar56._12_4_ = auVar100._12_4_ * fVar215;
      auVar56._16_4_ = auVar100._16_4_ * fVar234;
      auVar56._20_4_ = auVar100._20_4_ * fVar235;
      auVar56._24_4_ = auVar100._24_4_ * fVar236;
      auVar56._28_4_ = auVar25._28_4_ + fVar136;
      auVar101 = vsubps_avx(auVar55,auVar56);
      auVar24 = vminps_avx(auVar26,auVar102);
      auVar23 = vmaxps_avx(auVar26,auVar102);
      auVar25 = vminps_avx(auVar27,auVar28);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(auVar27,auVar28);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar26 = vminps_avx(auVar29,auVar30);
      auVar24 = vmaxps_avx(auVar29,auVar30);
      auVar100 = vminps_avx(auVar21,auVar101);
      auVar26 = vminps_avx(auVar26,auVar100);
      auVar26 = vminps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(auVar21,auVar101);
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vcmpps_avx(auVar26,local_138,2);
      auVar24 = vcmpps_avx(auVar24,local_158,5);
      auVar23 = vandps_avx(auVar24,auVar23);
      auVar99 = vandps_avx(auVar99,local_198);
      auVar24 = auVar99 & auVar23;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar99 = vandps_avx(auVar23,auVar99);
        uVar69 = vmovmskps_avx(auVar99);
      }
    }
    if (uVar69 != 0) {
      auStack_268[uVar71] = uVar69;
      uVar9 = vmovlps_avx(local_1d8);
      *(undefined8 *)(afStack_178 + uVar71 * 2) = uVar9;
      uVar76 = vmovlps_avx(_local_498);
      auStack_58[uVar71] = uVar76;
      uVar71 = (ulong)((int)uVar71 + 1);
    }
    auVar348 = ZEXT464(0) << 0x20;
    _local_458 = auVar22;
    do {
      if ((int)uVar71 == 0) {
        if (bVar66) {
          return local_4d9;
        }
        fVar79 = ray->tfar;
        auVar98._4_4_ = fVar79;
        auVar98._0_4_ = fVar79;
        auVar98._8_4_ = fVar79;
        auVar98._12_4_ = fVar79;
        auVar122 = vcmpps_avx(local_1e8,auVar98,2);
        uVar70 = vmovmskps_avx(auVar122);
        uVar68 = SUB84(auVar77,0) & uVar68 + 0xf & uVar70;
        local_4d9 = uVar68 != 0;
        if (!local_4d9) {
          return local_4d9;
        }
        goto LAB_00ff97f8;
      }
      uVar73 = (int)uVar71 - 1;
      uVar74 = (ulong)uVar73;
      uVar69 = auStack_268[uVar74];
      fVar136 = afStack_178[uVar74 * 2];
      fVar161 = afStack_178[uVar74 * 2 + 1];
      register0x00001588 = 0;
      local_498 = (undefined1  [8])auStack_58[uVar74];
      uVar76 = 0;
      if (uVar69 != 0) {
        for (; (uVar69 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
        }
      }
      uVar69 = uVar69 - 1 & uVar69;
      auStack_268[uVar74] = uVar69;
      if (uVar69 == 0) {
        uVar71 = (ulong)uVar73;
      }
      auVar224._8_4_ = 0x3f800000;
      auVar224._0_8_ = &DAT_3f8000003f800000;
      auVar224._12_4_ = 0x3f800000;
      fVar163 = (float)(uVar76 + 1) * 0.14285715;
      fVar162 = (1.0 - (float)uVar76 * 0.14285715) * fVar136 + fVar161 * (float)uVar76 * 0.14285715;
      fVar136 = (1.0 - fVar163) * fVar136 + fVar161 * fVar163;
      fVar161 = fVar136 - fVar162;
      _local_3e8 = ZEXT432((uint)fVar162);
      auVar171 = ZEXT416((uint)fVar162);
      _local_3c8 = ZEXT416((uint)fVar136);
      auVar122 = ZEXT416((uint)fVar162);
      if (0.16666667 <= fVar161) break;
      auVar122 = vshufps_avx(_local_498,_local_498,0x50);
      auVar18 = vsubps_avx(auVar224,auVar122);
      fVar163 = auVar122._0_4_;
      fVar187 = auVar122._4_4_;
      fVar188 = auVar122._8_4_;
      fVar189 = auVar122._12_4_;
      fVar190 = auVar18._0_4_;
      fVar211 = auVar18._4_4_;
      fVar212 = auVar18._8_4_;
      fVar213 = auVar18._12_4_;
      auVar174._0_4_ = auVar274._0_4_ * fVar163 + fVar190 * (float)local_2e8._0_4_;
      auVar174._4_4_ = auVar274._4_4_ * fVar187 + fVar211 * (float)local_2e8._4_4_;
      auVar174._8_4_ = auVar274._0_4_ * fVar188 + fVar212 * fStack_2e0;
      auVar174._12_4_ = auVar274._4_4_ * fVar189 + fVar213 * fStack_2dc;
      auVar201._0_4_ = auVar286._0_4_ * fVar163 + fVar190 * (float)local_278._0_4_;
      auVar201._4_4_ = auVar286._4_4_ * fVar187 + fVar211 * (float)local_278._4_4_;
      auVar201._8_4_ = auVar286._0_4_ * fVar188 + fVar212 * fStack_270;
      auVar201._12_4_ = auVar286._4_4_ * fVar189 + fVar213 * fStack_26c;
      auVar225._0_4_ = auVar301._0_4_ * fVar163 + fVar190 * (float)local_2f8._0_4_;
      auVar225._4_4_ = auVar301._4_4_ * fVar187 + fVar211 * (float)local_2f8._4_4_;
      auVar225._8_4_ = auVar301._0_4_ * fVar188 + fVar212 * fStack_2f0;
      auVar225._12_4_ = auVar301._4_4_ * fVar189 + fVar213 * fStack_2ec;
      auVar118._0_4_ = (float)local_308._0_4_ * fVar163 + auVar256._0_4_ * fVar190;
      auVar118._4_4_ = (float)local_308._4_4_ * fVar187 + auVar256._4_4_ * fVar211;
      auVar118._8_4_ = fStack_300 * fVar188 + auVar256._0_4_ * fVar212;
      auVar118._12_4_ = fStack_2fc * fVar189 + auVar256._4_4_ * fVar213;
      auVar158._16_16_ = auVar174;
      auVar158._0_16_ = auVar174;
      auVar184._16_16_ = auVar201;
      auVar184._0_16_ = auVar201;
      auVar210._16_16_ = auVar225;
      auVar210._0_16_ = auVar225;
      auVar99 = vshufps_avx(ZEXT2032(CONCAT416(fVar136,ZEXT416((uint)fVar162))),
                            ZEXT2032(CONCAT416(fVar136,ZEXT416((uint)fVar162))),0);
      auVar23 = vsubps_avx(auVar184,auVar158);
      fVar163 = auVar99._0_4_;
      fVar187 = auVar99._4_4_;
      fVar188 = auVar99._8_4_;
      fVar189 = auVar99._12_4_;
      fVar190 = auVar99._16_4_;
      fVar211 = auVar99._20_4_;
      fVar212 = auVar99._24_4_;
      auVar159._0_4_ = auVar174._0_4_ + auVar23._0_4_ * fVar163;
      auVar159._4_4_ = auVar174._4_4_ + auVar23._4_4_ * fVar187;
      auVar159._8_4_ = auVar174._8_4_ + auVar23._8_4_ * fVar188;
      auVar159._12_4_ = auVar174._12_4_ + auVar23._12_4_ * fVar189;
      auVar159._16_4_ = auVar174._0_4_ + auVar23._16_4_ * fVar190;
      auVar159._20_4_ = auVar174._4_4_ + auVar23._20_4_ * fVar211;
      auVar159._24_4_ = auVar174._8_4_ + auVar23._24_4_ * fVar212;
      auVar159._28_4_ = auVar174._12_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar210,auVar184);
      auVar185._0_4_ = auVar201._0_4_ + auVar23._0_4_ * fVar163;
      auVar185._4_4_ = auVar201._4_4_ + auVar23._4_4_ * fVar187;
      auVar185._8_4_ = auVar201._8_4_ + auVar23._8_4_ * fVar188;
      auVar185._12_4_ = auVar201._12_4_ + auVar23._12_4_ * fVar189;
      auVar185._16_4_ = auVar201._0_4_ + auVar23._16_4_ * fVar190;
      auVar185._20_4_ = auVar201._4_4_ + auVar23._20_4_ * fVar211;
      auVar185._24_4_ = auVar201._8_4_ + auVar23._24_4_ * fVar212;
      auVar185._28_4_ = auVar201._12_4_ + auVar23._28_4_;
      auVar122 = vsubps_avx(auVar118,auVar225);
      auVar131._0_4_ = auVar225._0_4_ + auVar122._0_4_ * fVar163;
      auVar131._4_4_ = auVar225._4_4_ + auVar122._4_4_ * fVar187;
      auVar131._8_4_ = auVar225._8_4_ + auVar122._8_4_ * fVar188;
      auVar131._12_4_ = auVar225._12_4_ + auVar122._12_4_ * fVar189;
      auVar131._16_4_ = auVar225._0_4_ + auVar122._0_4_ * fVar190;
      auVar131._20_4_ = auVar225._4_4_ + auVar122._4_4_ * fVar211;
      auVar131._24_4_ = auVar225._8_4_ + auVar122._8_4_ * fVar212;
      auVar131._28_4_ = auVar225._12_4_ + auVar122._12_4_;
      auVar23 = vsubps_avx(auVar185,auVar159);
      auVar160._0_4_ = auVar159._0_4_ + fVar163 * auVar23._0_4_;
      auVar160._4_4_ = auVar159._4_4_ + fVar187 * auVar23._4_4_;
      auVar160._8_4_ = auVar159._8_4_ + fVar188 * auVar23._8_4_;
      auVar160._12_4_ = auVar159._12_4_ + fVar189 * auVar23._12_4_;
      auVar160._16_4_ = auVar159._16_4_ + fVar190 * auVar23._16_4_;
      auVar160._20_4_ = auVar159._20_4_ + fVar211 * auVar23._20_4_;
      auVar160._24_4_ = auVar159._24_4_ + fVar212 * auVar23._24_4_;
      auVar160._28_4_ = auVar159._28_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar131,auVar185);
      auVar132._0_4_ = auVar185._0_4_ + fVar163 * auVar23._0_4_;
      auVar132._4_4_ = auVar185._4_4_ + fVar187 * auVar23._4_4_;
      auVar132._8_4_ = auVar185._8_4_ + fVar188 * auVar23._8_4_;
      auVar132._12_4_ = auVar185._12_4_ + fVar189 * auVar23._12_4_;
      auVar132._16_4_ = auVar185._16_4_ + fVar190 * auVar23._16_4_;
      auVar132._20_4_ = auVar185._20_4_ + fVar211 * auVar23._20_4_;
      auVar132._24_4_ = auVar185._24_4_ + fVar212 * auVar23._24_4_;
      auVar132._28_4_ = auVar185._28_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar132,auVar160);
      auVar175._0_4_ = auVar160._0_4_ + fVar163 * auVar23._0_4_;
      auVar175._4_4_ = auVar160._4_4_ + fVar187 * auVar23._4_4_;
      auVar175._8_4_ = auVar160._8_4_ + fVar188 * auVar23._8_4_;
      auVar175._12_4_ = auVar160._12_4_ + fVar189 * auVar23._12_4_;
      auVar186._16_4_ = auVar160._16_4_ + fVar190 * auVar23._16_4_;
      auVar186._0_16_ = auVar175;
      auVar186._20_4_ = auVar160._20_4_ + fVar211 * auVar23._20_4_;
      auVar186._24_4_ = auVar160._24_4_ + fVar212 * auVar23._24_4_;
      auVar186._28_4_ = auVar160._28_4_ + auVar185._28_4_;
      fVar163 = auVar23._4_4_ * 3.0;
      auVar151 = auVar186._16_16_;
      auVar121 = vshufps_avx(ZEXT416((uint)(fVar161 * 0.33333334)),
                             ZEXT416((uint)(fVar161 * 0.33333334)),0);
      auVar287._0_4_ = auVar175._0_4_ + auVar121._0_4_ * auVar23._0_4_ * 3.0;
      auVar287._4_4_ = auVar175._4_4_ + auVar121._4_4_ * fVar163;
      auVar287._8_4_ = auVar175._8_4_ + auVar121._8_4_ * auVar23._8_4_ * 3.0;
      auVar287._12_4_ = auVar175._12_4_ + auVar121._12_4_ * auVar23._12_4_ * 3.0;
      auVar232 = vshufpd_avx(auVar175,auVar175,3);
      auVar147 = vshufpd_avx(auVar151,auVar151,3);
      _local_3a8 = auVar232;
      auVar24 = _local_3a8;
      auVar122 = vsubps_avx(auVar232,auVar175);
      _local_438 = auVar147;
      auVar18 = vsubps_avx(auVar147,auVar151);
      auVar119._0_4_ = auVar122._0_4_ + auVar18._0_4_;
      auVar119._4_4_ = auVar122._4_4_ + auVar18._4_4_;
      auVar119._8_4_ = auVar122._8_4_ + auVar18._8_4_;
      auVar119._12_4_ = auVar122._12_4_ + auVar18._12_4_;
      auVar122 = vmovshdup_avx(auVar175);
      auVar18 = vmovshdup_avx(auVar287);
      auVar179 = vshufps_avx(auVar119,auVar119,0);
      auVar96 = vshufps_avx(auVar119,auVar119,0x55);
      fVar211 = auVar96._0_4_;
      fVar212 = auVar96._4_4_;
      fVar213 = auVar96._8_4_;
      fVar215 = auVar96._12_4_;
      fVar187 = auVar179._0_4_;
      fVar188 = auVar179._4_4_;
      fVar189 = auVar179._8_4_;
      fVar190 = auVar179._12_4_;
      auVar275._0_4_ = fVar187 * auVar175._0_4_ + fVar211 * auVar122._0_4_;
      auVar275._4_4_ = fVar188 * auVar175._4_4_ + fVar212 * auVar122._4_4_;
      auVar275._8_4_ = fVar189 * auVar175._8_4_ + fVar213 * auVar122._8_4_;
      auVar275._12_4_ = fVar190 * auVar175._12_4_ + fVar215 * auVar122._12_4_;
      _local_458 = auVar287;
      auVar288._0_4_ = auVar287._0_4_ * fVar187 + fVar211 * auVar18._0_4_;
      auVar288._4_4_ = auVar287._4_4_ * fVar188 + fVar212 * auVar18._4_4_;
      auVar288._8_4_ = auVar287._8_4_ * fVar189 + fVar213 * auVar18._8_4_;
      auVar288._12_4_ = auVar287._12_4_ * fVar190 + fVar215 * auVar18._12_4_;
      auVar18 = vshufps_avx(auVar275,auVar275,0xe8);
      auVar179 = vshufps_avx(auVar288,auVar288,0xe8);
      auVar122 = vcmpps_avx(auVar18,auVar179,1);
      uVar69 = vextractps_avx(auVar122,0);
      auVar96 = auVar288;
      if ((uVar69 & 1) == 0) {
        auVar96 = auVar275;
      }
      auVar120._0_4_ = auVar121._0_4_ * auVar23._16_4_ * 3.0;
      auVar120._4_4_ = auVar121._4_4_ * fVar163;
      auVar120._8_4_ = auVar121._8_4_ * auVar23._24_4_ * 3.0;
      auVar120._12_4_ = auVar121._12_4_ * auVar99._28_4_;
      auVar20 = vsubps_avx(auVar151,auVar120);
      auVar121 = vmovshdup_avx(auVar20);
      auVar151 = vmovshdup_avx(auVar151);
      fVar163 = auVar20._0_4_;
      fVar234 = auVar20._4_4_;
      auVar345._0_4_ = fVar187 * fVar163 + fVar211 * auVar121._0_4_;
      auVar345._4_4_ = fVar188 * fVar234 + fVar212 * auVar121._4_4_;
      auVar345._8_4_ = fVar189 * auVar20._8_4_ + fVar213 * auVar121._8_4_;
      auVar345._12_4_ = fVar190 * auVar20._12_4_ + fVar215 * auVar121._12_4_;
      auVar327._0_4_ = fVar187 * auVar186._16_4_ + fVar211 * auVar151._0_4_;
      auVar327._4_4_ = fVar188 * auVar186._20_4_ + fVar212 * auVar151._4_4_;
      auVar327._8_4_ = fVar189 * auVar186._24_4_ + fVar213 * auVar151._8_4_;
      auVar327._12_4_ = fVar190 * auVar186._28_4_ + fVar215 * auVar151._12_4_;
      auVar151 = vshufps_avx(auVar345,auVar345,0xe8);
      auVar19 = vshufps_avx(auVar327,auVar327,0xe8);
      auVar121 = vcmpps_avx(auVar151,auVar19,1);
      uVar69 = vextractps_avx(auVar121,0);
      auVar258 = auVar327;
      if ((uVar69 & 1) == 0) {
        auVar258 = auVar345;
      }
      auVar96 = vmaxss_avx(auVar258,auVar96);
      auVar18 = vminps_avx(auVar18,auVar179);
      auVar179 = vminps_avx(auVar151,auVar19);
      auVar179 = vminps_avx(auVar18,auVar179);
      auVar122 = vshufps_avx(auVar122,auVar122,0x55);
      auVar122 = vblendps_avx(auVar122,auVar121,2);
      auVar121 = vpslld_avx(auVar122,0x1f);
      auVar122 = vshufpd_avx(auVar288,auVar288,1);
      auVar122 = vinsertps_avx(auVar122,auVar327,0x9c);
      auVar18 = vshufpd_avx(auVar275,auVar275,1);
      auVar18 = vinsertps_avx(auVar18,auVar345,0x9c);
      auVar122 = vblendvps_avx(auVar18,auVar122,auVar121);
      auVar18 = vmovshdup_avx(auVar122);
      auVar122 = vmaxss_avx(auVar18,auVar122);
      fVar189 = auVar179._0_4_;
      auVar18 = vmovshdup_avx(auVar179);
      fVar188 = auVar122._0_4_;
      fVar190 = auVar18._0_4_;
      fVar187 = auVar96._0_4_;
      _local_3a8 = auVar24;
      if ((0.0001 <= fVar189) || (fVar188 <= -0.0001)) {
        if ((-0.0001 < fVar187 && fVar190 < 0.0001) ||
           ((fVar189 < 0.0001 && -0.0001 < fVar187 || (fVar190 < 0.0001 && -0.0001 < fVar188))))
        goto LAB_00ffadbd;
LAB_00ffb9c0:
        bVar57 = true;
        auVar348 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_00ffadbd:
        auVar348 = ZEXT464(0) << 0x20;
        auVar121 = vcmpps_avx(auVar179,ZEXT416(0) << 0x20,1);
        auVar18 = vcmpss_avx(auVar96,ZEXT416(0),1);
        auVar337._8_4_ = 0x3f800000;
        auVar337._0_8_ = &DAT_3f8000003f800000;
        auVar337._12_4_ = 0x3f800000;
        auVar226._8_4_ = 0xbf800000;
        auVar226._0_8_ = 0xbf800000bf800000;
        auVar226._12_4_ = 0xbf800000;
        auVar18 = vblendvps_avx(auVar337,auVar226,auVar18);
        auVar121 = vblendvps_avx(auVar337,auVar226,auVar121);
        auVar151 = vcmpss_avx(auVar18,auVar121,4);
        auVar151 = vpshufd_avx(ZEXT416(auVar151._0_4_ & 1),0x50);
        auVar151 = vpslld_avx(auVar151,0x1f);
        auVar151 = vpsrad_avx(auVar151,0x1f);
        auVar151 = vpandn_avx(auVar151,_DAT_02020eb0);
        auVar19 = vmovshdup_avx(auVar121);
        fVar211 = auVar19._0_4_;
        if ((auVar121._0_4_ != fVar211) || (NAN(auVar121._0_4_) || NAN(fVar211))) {
          if ((fVar190 != fVar189) || (NAN(fVar190) || NAN(fVar189))) {
            fVar189 = -fVar189 / (fVar190 - fVar189);
            auVar121 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar189) * 0.0 + fVar189)));
          }
          else {
            auVar121 = vcmpss_avx(auVar179,ZEXT416(0),0);
            auVar121 = vpshufd_avx(ZEXT416(auVar121._0_4_ & 1),0x50);
            auVar121 = vpslld_avx(auVar121,0x1f);
            auVar121 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar121);
          }
          auVar19 = vcmpps_avx(auVar151,auVar121,1);
          auVar179 = vblendps_avx(auVar151,auVar121,2);
          auVar121 = vblendps_avx(auVar121,auVar151,2);
          auVar151 = vblendvps_avx(auVar121,auVar179,auVar19);
        }
        auVar122 = vcmpss_avx(auVar122,ZEXT416(0),1);
        auVar152._8_4_ = 0xbf800000;
        auVar152._0_8_ = 0xbf800000bf800000;
        auVar152._12_4_ = 0xbf800000;
        auVar122 = vblendvps_avx(auVar337,auVar152,auVar122);
        fVar189 = auVar122._0_4_;
        if ((auVar18._0_4_ != fVar189) || (NAN(auVar18._0_4_) || NAN(fVar189))) {
          if ((fVar188 != fVar187) || (NAN(fVar188) || NAN(fVar187))) {
            fVar187 = -fVar187 / (fVar188 - fVar187);
            auVar122 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar187) * 0.0 + fVar187)));
          }
          else {
            auVar122 = vcmpss_avx(auVar96,ZEXT416(0),0);
            auVar122 = vpshufd_avx(ZEXT416(auVar122._0_4_ & 1),0x50);
            auVar122 = vpslld_avx(auVar122,0x1f);
            auVar122 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar122);
          }
          auVar121 = vcmpps_avx(auVar151,auVar122,1);
          auVar18 = vblendps_avx(auVar151,auVar122,2);
          auVar122 = vblendps_avx(auVar122,auVar151,2);
          auVar151 = vblendvps_avx(auVar122,auVar18,auVar121);
        }
        if ((fVar211 != fVar189) || (NAN(fVar211) || NAN(fVar189))) {
          auVar122 = vcmpps_avx(auVar151,auVar337,1);
          auVar18 = vinsertps_avx(auVar151,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar227._4_12_ = auVar151._4_12_;
          auVar227._0_4_ = 0x3f800000;
          auVar151 = vblendvps_avx(auVar227,auVar18,auVar122);
        }
        auVar122 = vcmpps_avx(auVar151,_DAT_01fec6f0,1);
        auVar58._12_4_ = 0;
        auVar58._0_12_ = auVar151._4_12_;
        auVar18 = vinsertps_avx(auVar151,ZEXT416(0x3f800000),0x10);
        auVar122 = vblendvps_avx(auVar18,auVar58 << 0x20,auVar122);
        auVar18 = vmovshdup_avx(auVar122);
        bVar57 = true;
        if (auVar122._0_4_ <= auVar18._0_4_) {
          auVar123._0_4_ = auVar122._0_4_ + -0.1;
          auVar123._4_4_ = auVar122._4_4_ + 0.1;
          auVar123._8_4_ = auVar122._8_4_ + 0.0;
          auVar123._12_4_ = auVar122._12_4_ + 0.0;
          auVar121 = vshufpd_avx(auVar287,auVar287,3);
          register0x000012c8 = 0x3f80000000000000;
          local_458 = (undefined1  [8])0x3f80000000000000;
          auVar122 = vcmpps_avx(auVar123,_local_458,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar123._4_12_;
          auVar18 = vinsertps_avx(auVar123,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar122 = vblendvps_avx(auVar18,auVar59 << 0x20,auVar122);
          auVar18 = vshufpd_avx(auVar20,auVar20,3);
          auVar179 = vshufps_avx(auVar122,auVar122,0x50);
          auVar96 = vsubps_avx(auVar337,auVar179);
          local_3a8._0_4_ = auVar232._0_4_;
          local_3a8._4_4_ = auVar232._4_4_;
          fStack_3a0 = auVar232._8_4_;
          fStack_39c = auVar232._12_4_;
          fVar187 = auVar179._0_4_;
          fVar188 = auVar179._4_4_;
          fVar189 = auVar179._8_4_;
          fVar190 = auVar179._12_4_;
          local_438._0_4_ = auVar147._0_4_;
          local_438._4_4_ = auVar147._4_4_;
          fStack_430 = auVar147._8_4_;
          fStack_42c = auVar147._12_4_;
          fVar211 = auVar96._0_4_;
          fVar212 = auVar96._4_4_;
          fVar213 = auVar96._8_4_;
          fVar215 = auVar96._12_4_;
          auVar153._0_4_ = fVar187 * (float)local_3a8._0_4_ + fVar211 * auVar175._0_4_;
          auVar153._4_4_ = fVar188 * (float)local_3a8._4_4_ + fVar212 * auVar175._4_4_;
          auVar153._8_4_ = fVar189 * fStack_3a0 + fVar213 * auVar175._0_4_;
          auVar153._12_4_ = fVar190 * fStack_39c + fVar215 * auVar175._4_4_;
          auVar202._0_4_ = fVar187 * auVar121._0_4_ + fVar211 * auVar287._0_4_;
          auVar202._4_4_ = fVar188 * auVar121._4_4_ + fVar212 * auVar287._4_4_;
          auVar202._8_4_ = fVar189 * auVar121._8_4_ + fVar213 * auVar287._0_4_;
          auVar202._12_4_ = fVar190 * auVar121._12_4_ + fVar215 * auVar287._4_4_;
          auVar259._0_4_ = fVar187 * auVar18._0_4_ + fVar211 * fVar163;
          auVar259._4_4_ = fVar188 * auVar18._4_4_ + fVar212 * fVar234;
          auVar259._8_4_ = fVar189 * auVar18._8_4_ + fVar213 * fVar163;
          auVar259._12_4_ = fVar190 * auVar18._12_4_ + fVar215 * fVar234;
          auVar276._0_4_ = fVar187 * (float)local_438._0_4_ + fVar211 * auVar186._16_4_;
          auVar276._4_4_ = fVar188 * (float)local_438._4_4_ + fVar212 * auVar186._20_4_;
          auVar276._8_4_ = fVar189 * fStack_430 + fVar213 * auVar186._16_4_;
          auVar276._12_4_ = fVar190 * fStack_42c + fVar215 * auVar186._20_4_;
          auVar147 = vsubps_avx(auVar337,auVar122);
          auVar18 = vmovshdup_avx(_local_498);
          auVar232 = vmovsldup_avx(_local_498);
          local_498._0_4_ = auVar147._0_4_ * auVar232._0_4_ + auVar18._0_4_ * auVar122._0_4_;
          local_498._4_4_ = auVar147._4_4_ * auVar232._4_4_ + auVar18._4_4_ * auVar122._4_4_;
          fStack_490 = auVar147._8_4_ * auVar232._8_4_ + auVar18._8_4_ * auVar122._8_4_;
          fStack_48c = auVar147._12_4_ * auVar232._12_4_ + auVar18._12_4_ * auVar122._12_4_;
          _local_438 = vmovshdup_avx(_local_498);
          auVar122 = vsubps_avx(auVar202,auVar153);
          auVar228._0_4_ = auVar122._0_4_ * 3.0;
          auVar228._4_4_ = auVar122._4_4_ * 3.0;
          auVar228._8_4_ = auVar122._8_4_ * 3.0;
          auVar228._12_4_ = auVar122._12_4_ * 3.0;
          auVar122 = vsubps_avx(auVar259,auVar202);
          auVar243._0_4_ = auVar122._0_4_ * 3.0;
          auVar243._4_4_ = auVar122._4_4_ * 3.0;
          auVar243._8_4_ = auVar122._8_4_ * 3.0;
          auVar243._12_4_ = auVar122._12_4_ * 3.0;
          auVar122 = vsubps_avx(auVar276,auVar259);
          auVar289._0_4_ = auVar122._0_4_ * 3.0;
          auVar289._4_4_ = auVar122._4_4_ * 3.0;
          auVar289._8_4_ = auVar122._8_4_ * 3.0;
          auVar289._12_4_ = auVar122._12_4_ * 3.0;
          auVar18 = vminps_avx(auVar243,auVar289);
          auVar122 = vmaxps_avx(auVar243,auVar289);
          auVar18 = vminps_avx(auVar228,auVar18);
          auVar122 = vmaxps_avx(auVar228,auVar122);
          auVar232 = vshufpd_avx(auVar18,auVar18,3);
          auVar147 = vshufpd_avx(auVar122,auVar122,3);
          auVar18 = vminps_avx(auVar18,auVar232);
          auVar122 = vmaxps_avx(auVar122,auVar147);
          auVar232 = vshufps_avx(ZEXT416((uint)(1.0 / fVar161)),ZEXT416((uint)(1.0 / fVar161)),0);
          auVar229._0_4_ = auVar232._0_4_ * auVar18._0_4_;
          auVar229._4_4_ = auVar232._4_4_ * auVar18._4_4_;
          auVar229._8_4_ = auVar232._8_4_ * auVar18._8_4_;
          auVar229._12_4_ = auVar232._12_4_ * auVar18._12_4_;
          auVar244._0_4_ = auVar122._0_4_ * auVar232._0_4_;
          auVar244._4_4_ = auVar122._4_4_ * auVar232._4_4_;
          auVar244._8_4_ = auVar122._8_4_ * auVar232._8_4_;
          auVar244._12_4_ = auVar122._12_4_ * auVar232._12_4_;
          auVar96 = ZEXT416((uint)(1.0 / (local_438._0_4_ - (float)local_498._0_4_)));
          auVar122 = vshufpd_avx(auVar153,auVar153,3);
          auVar18 = vshufpd_avx(auVar202,auVar202,3);
          auVar232 = vshufpd_avx(auVar259,auVar259,3);
          auVar147 = vshufpd_avx(auVar276,auVar276,3);
          auVar122 = vsubps_avx(auVar122,auVar153);
          auVar121 = vsubps_avx(auVar18,auVar202);
          auVar179 = vsubps_avx(auVar232,auVar259);
          auVar147 = vsubps_avx(auVar147,auVar276);
          auVar18 = vminps_avx(auVar122,auVar121);
          auVar122 = vmaxps_avx(auVar122,auVar121);
          auVar232 = vminps_avx(auVar179,auVar147);
          auVar232 = vminps_avx(auVar18,auVar232);
          auVar18 = vmaxps_avx(auVar179,auVar147);
          auVar122 = vmaxps_avx(auVar122,auVar18);
          auVar18 = vshufps_avx(auVar96,auVar96,0);
          auVar302._0_4_ = auVar18._0_4_ * auVar232._0_4_;
          auVar302._4_4_ = auVar18._4_4_ * auVar232._4_4_;
          auVar302._8_4_ = auVar18._8_4_ * auVar232._8_4_;
          auVar302._12_4_ = auVar18._12_4_ * auVar232._12_4_;
          auVar310._0_4_ = auVar18._0_4_ * auVar122._0_4_;
          auVar310._4_4_ = auVar18._4_4_ * auVar122._4_4_;
          auVar310._8_4_ = auVar18._8_4_ * auVar122._8_4_;
          auVar310._12_4_ = auVar18._12_4_ * auVar122._12_4_;
          auVar122 = vmovsldup_avx(_local_498);
          auVar260._4_12_ = auVar122._4_12_;
          auVar260._0_4_ = fVar162;
          auVar277._4_12_ = local_498._4_12_;
          auVar277._0_4_ = fVar136;
          auVar97._0_4_ = (fVar136 + fVar162) * 0.5;
          auVar97._4_4_ = ((float)local_498._4_4_ + auVar122._4_4_) * 0.5;
          auVar97._8_4_ = (fStack_490 + auVar122._8_4_) * 0.5;
          auVar97._12_4_ = (fStack_48c + auVar122._12_4_) * 0.5;
          auVar122 = vshufps_avx(auVar97,auVar97,0);
          fVar163 = auVar122._0_4_;
          fVar187 = auVar122._4_4_;
          fVar188 = auVar122._8_4_;
          fVar189 = auVar122._12_4_;
          auVar203._0_4_ = fVar163 * (float)local_1a8._0_4_ + (float)local_3f8._0_4_;
          auVar203._4_4_ = fVar187 * (float)local_1a8._4_4_ + (float)local_3f8._4_4_;
          auVar203._8_4_ = fVar188 * fStack_1a0 + fStack_3f0;
          auVar203._12_4_ = fVar189 * fStack_19c + fStack_3ec;
          auVar290._0_4_ = fVar163 * (float)local_1b8._0_4_ + (float)local_408._0_4_;
          auVar290._4_4_ = fVar187 * (float)local_1b8._4_4_ + (float)local_408._4_4_;
          auVar290._8_4_ = fVar188 * fStack_1b0 + fStack_400;
          auVar290._12_4_ = fVar189 * fStack_1ac + fStack_3fc;
          auVar324._0_4_ = fVar163 * (float)local_1c8._0_4_ + (float)local_418._0_4_;
          auVar324._4_4_ = fVar187 * (float)local_1c8._4_4_ + (float)local_418._4_4_;
          auVar324._8_4_ = fVar188 * fStack_1c0 + fStack_410;
          auVar324._12_4_ = fVar189 * fStack_1bc + fStack_40c;
          auVar122 = vsubps_avx(auVar290,auVar203);
          auVar204._0_4_ = auVar122._0_4_ * fVar163 + auVar203._0_4_;
          auVar204._4_4_ = auVar122._4_4_ * fVar187 + auVar203._4_4_;
          auVar204._8_4_ = auVar122._8_4_ * fVar188 + auVar203._8_4_;
          auVar204._12_4_ = auVar122._12_4_ * fVar189 + auVar203._12_4_;
          auVar122 = vsubps_avx(auVar324,auVar290);
          auVar291._0_4_ = auVar290._0_4_ + auVar122._0_4_ * fVar163;
          auVar291._4_4_ = auVar290._4_4_ + auVar122._4_4_ * fVar187;
          auVar291._8_4_ = auVar290._8_4_ + auVar122._8_4_ * fVar188;
          auVar291._12_4_ = auVar290._12_4_ + auVar122._12_4_ * fVar189;
          auVar122 = vsubps_avx(auVar291,auVar204);
          fVar163 = auVar204._0_4_ + auVar122._0_4_ * fVar163;
          fVar187 = auVar204._4_4_ + auVar122._4_4_ * fVar187;
          auVar154._0_8_ = CONCAT44(fVar187,fVar163);
          auVar154._8_4_ = auVar204._8_4_ + auVar122._8_4_ * fVar188;
          auVar154._12_4_ = auVar204._12_4_ + auVar122._12_4_ * fVar189;
          fVar188 = auVar122._0_4_ * 3.0;
          fVar189 = auVar122._4_4_ * 3.0;
          auVar205._0_8_ = CONCAT44(fVar189,fVar188);
          auVar205._8_4_ = auVar122._8_4_ * 3.0;
          auVar205._12_4_ = auVar122._12_4_ * 3.0;
          auVar292._8_8_ = auVar154._0_8_;
          auVar292._0_8_ = auVar154._0_8_;
          auVar122 = vshufpd_avx(auVar154,auVar154,3);
          auVar18 = vshufps_avx(auVar97,auVar97,0x55);
          auVar179 = vsubps_avx(auVar122,auVar292);
          auVar293._0_4_ = auVar18._0_4_ * auVar179._0_4_ + fVar163;
          auVar293._4_4_ = auVar18._4_4_ * auVar179._4_4_ + fVar187;
          auVar293._8_4_ = auVar18._8_4_ * auVar179._8_4_ + fVar163;
          auVar293._12_4_ = auVar18._12_4_ * auVar179._12_4_ + fVar187;
          auVar328._8_8_ = auVar205._0_8_;
          auVar328._0_8_ = auVar205._0_8_;
          auVar122 = vshufpd_avx(auVar205,auVar205,1);
          auVar122 = vsubps_avx(auVar122,auVar328);
          auVar206._0_4_ = fVar188 + auVar18._0_4_ * auVar122._0_4_;
          auVar206._4_4_ = fVar189 + auVar18._4_4_ * auVar122._4_4_;
          auVar206._8_4_ = fVar188 + auVar18._8_4_ * auVar122._8_4_;
          auVar206._12_4_ = fVar189 + auVar18._12_4_ * auVar122._12_4_;
          auVar18 = vmovshdup_avx(auVar206);
          auVar329._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
          auVar329._8_4_ = auVar18._8_4_ ^ 0x80000000;
          auVar329._12_4_ = auVar18._12_4_ ^ 0x80000000;
          auVar232 = vmovshdup_avx(auVar179);
          auVar122 = vunpcklps_avx(auVar232,auVar329);
          auVar147 = vshufps_avx(auVar122,auVar329,4);
          auVar155._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
          auVar155._8_4_ = -auVar179._8_4_;
          auVar155._12_4_ = -auVar179._12_4_;
          auVar122 = vmovlhps_avx(auVar155,auVar206);
          auVar121 = vshufps_avx(auVar122,auVar206,8);
          auVar122 = ZEXT416((uint)(auVar232._0_4_ * auVar206._0_4_ - auVar18._0_4_ * auVar179._0_4_
                                   ));
          auVar18 = vshufps_avx(auVar122,auVar122,0);
          auVar122 = vdivps_avx(auVar147,auVar18);
          auVar18 = vdivps_avx(auVar121,auVar18);
          auVar121 = vinsertps_avx(auVar229,auVar302,0x1c);
          auVar179 = vinsertps_avx(auVar244,auVar310,0x1c);
          auVar96 = vinsertps_avx(auVar302,auVar229,0x4c);
          auVar151 = vinsertps_avx(auVar310,auVar244,0x4c);
          auVar232 = vmovsldup_avx(auVar122);
          auVar311._0_4_ = auVar232._0_4_ * auVar121._0_4_;
          auVar311._4_4_ = auVar232._4_4_ * auVar121._4_4_;
          auVar311._8_4_ = auVar232._8_4_ * auVar121._8_4_;
          auVar311._12_4_ = auVar232._12_4_ * auVar121._12_4_;
          auVar303._0_4_ = auVar232._0_4_ * auVar179._0_4_;
          auVar303._4_4_ = auVar232._4_4_ * auVar179._4_4_;
          auVar303._8_4_ = auVar232._8_4_ * auVar179._8_4_;
          auVar303._12_4_ = auVar232._12_4_ * auVar179._12_4_;
          auVar147 = vminps_avx(auVar311,auVar303);
          auVar232 = vmaxps_avx(auVar303,auVar311);
          auVar19 = vmovsldup_avx(auVar18);
          auVar346._0_4_ = auVar19._0_4_ * auVar96._0_4_;
          auVar346._4_4_ = auVar19._4_4_ * auVar96._4_4_;
          auVar346._8_4_ = auVar19._8_4_ * auVar96._8_4_;
          auVar346._12_4_ = auVar19._12_4_ * auVar96._12_4_;
          auVar304._0_4_ = auVar19._0_4_ * auVar151._0_4_;
          auVar304._4_4_ = auVar19._4_4_ * auVar151._4_4_;
          auVar304._8_4_ = auVar19._8_4_ * auVar151._8_4_;
          auVar304._12_4_ = auVar19._12_4_ * auVar151._12_4_;
          auVar19 = vminps_avx(auVar346,auVar304);
          auVar124._0_4_ = auVar147._0_4_ + auVar19._0_4_;
          auVar124._4_4_ = auVar147._4_4_ + auVar19._4_4_;
          auVar124._8_4_ = auVar147._8_4_ + auVar19._8_4_;
          auVar124._12_4_ = auVar147._12_4_ + auVar19._12_4_;
          auVar147 = vmaxps_avx(auVar304,auVar346);
          auVar19 = vsubps_avx(auVar260,auVar97);
          auVar20 = vsubps_avx(auVar277,auVar97);
          auVar278._0_4_ = auVar232._0_4_ + auVar147._0_4_;
          auVar278._4_4_ = auVar232._4_4_ + auVar147._4_4_;
          auVar278._8_4_ = auVar232._8_4_ + auVar147._8_4_;
          auVar278._12_4_ = auVar232._12_4_ + auVar147._12_4_;
          auVar312._8_8_ = 0x3f800000;
          auVar312._0_8_ = 0x3f800000;
          auVar232 = vsubps_avx(auVar312,auVar278);
          auVar147 = vsubps_avx(auVar312,auVar124);
          fVar212 = auVar19._0_4_;
          auVar313._0_4_ = fVar212 * auVar232._0_4_;
          fVar213 = auVar19._4_4_;
          auVar313._4_4_ = fVar213 * auVar232._4_4_;
          fVar215 = auVar19._8_4_;
          auVar313._8_4_ = fVar215 * auVar232._8_4_;
          fVar234 = auVar19._12_4_;
          auVar313._12_4_ = fVar234 * auVar232._12_4_;
          fVar188 = auVar20._0_4_;
          auVar279._0_4_ = auVar232._0_4_ * fVar188;
          fVar189 = auVar20._4_4_;
          auVar279._4_4_ = auVar232._4_4_ * fVar189;
          fVar190 = auVar20._8_4_;
          auVar279._8_4_ = auVar232._8_4_ * fVar190;
          fVar211 = auVar20._12_4_;
          auVar279._12_4_ = auVar232._12_4_ * fVar211;
          auVar338._0_4_ = fVar212 * auVar147._0_4_;
          auVar338._4_4_ = fVar213 * auVar147._4_4_;
          auVar338._8_4_ = fVar215 * auVar147._8_4_;
          auVar338._12_4_ = fVar234 * auVar147._12_4_;
          auVar125._0_4_ = fVar188 * auVar147._0_4_;
          auVar125._4_4_ = fVar189 * auVar147._4_4_;
          auVar125._8_4_ = fVar190 * auVar147._8_4_;
          auVar125._12_4_ = fVar211 * auVar147._12_4_;
          auVar232 = vminps_avx(auVar313,auVar338);
          auVar147 = vminps_avx(auVar279,auVar125);
          auVar19 = vminps_avx(auVar232,auVar147);
          auVar232 = vmaxps_avx(auVar338,auVar313);
          auVar147 = vmaxps_avx(auVar125,auVar279);
          auVar20 = vshufps_avx(auVar97,auVar97,0x54);
          auVar147 = vmaxps_avx(auVar147,auVar232);
          auVar258 = vshufps_avx(auVar293,auVar293,0);
          auVar80 = vshufps_avx(auVar293,auVar293,0x55);
          auVar232 = vhaddps_avx(auVar19,auVar19);
          auVar147 = vhaddps_avx(auVar147,auVar147);
          auVar280._0_4_ = auVar258._0_4_ * auVar122._0_4_ + auVar80._0_4_ * auVar18._0_4_;
          auVar280._4_4_ = auVar258._4_4_ * auVar122._4_4_ + auVar80._4_4_ * auVar18._4_4_;
          auVar280._8_4_ = auVar258._8_4_ * auVar122._8_4_ + auVar80._8_4_ * auVar18._8_4_;
          auVar280._12_4_ = auVar258._12_4_ * auVar122._12_4_ + auVar80._12_4_ * auVar18._12_4_;
          auVar19 = vsubps_avx(auVar20,auVar280);
          fVar163 = auVar19._0_4_ + auVar232._0_4_;
          fVar187 = auVar19._0_4_ + auVar147._0_4_;
          auVar232 = vmaxss_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar163));
          auVar147 = vminss_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar136));
          if (auVar232._0_4_ <= auVar147._0_4_) {
            auVar232 = vmovshdup_avx(auVar122);
            auVar176._0_4_ = auVar121._0_4_ * auVar232._0_4_;
            auVar176._4_4_ = auVar121._4_4_ * auVar232._4_4_;
            auVar176._8_4_ = auVar121._8_4_ * auVar232._8_4_;
            auVar176._12_4_ = auVar121._12_4_ * auVar232._12_4_;
            auVar126._0_4_ = auVar179._0_4_ * auVar232._0_4_;
            auVar126._4_4_ = auVar179._4_4_ * auVar232._4_4_;
            auVar126._8_4_ = auVar179._8_4_ * auVar232._8_4_;
            auVar126._12_4_ = auVar179._12_4_ * auVar232._12_4_;
            auVar147 = vminps_avx(auVar176,auVar126);
            auVar232 = vmaxps_avx(auVar126,auVar176);
            auVar121 = vmovshdup_avx(auVar18);
            auVar230._0_4_ = auVar121._0_4_ * auVar96._0_4_;
            auVar230._4_4_ = auVar121._4_4_ * auVar96._4_4_;
            auVar230._8_4_ = auVar121._8_4_ * auVar96._8_4_;
            auVar230._12_4_ = auVar121._12_4_ * auVar96._12_4_;
            auVar177._0_4_ = auVar121._0_4_ * auVar151._0_4_;
            auVar177._4_4_ = auVar121._4_4_ * auVar151._4_4_;
            auVar177._8_4_ = auVar121._8_4_ * auVar151._8_4_;
            auVar177._12_4_ = auVar121._12_4_ * auVar151._12_4_;
            auVar121 = vminps_avx(auVar230,auVar177);
            auVar245._0_4_ = auVar147._0_4_ + auVar121._0_4_;
            auVar245._4_4_ = auVar147._4_4_ + auVar121._4_4_;
            auVar245._8_4_ = auVar147._8_4_ + auVar121._8_4_;
            auVar245._12_4_ = auVar147._12_4_ + auVar121._12_4_;
            auVar147 = vmaxps_avx(auVar177,auVar230);
            auVar127._0_4_ = auVar232._0_4_ + auVar147._0_4_;
            auVar127._4_4_ = auVar232._4_4_ + auVar147._4_4_;
            auVar127._8_4_ = auVar232._8_4_ + auVar147._8_4_;
            auVar127._12_4_ = auVar232._12_4_ + auVar147._12_4_;
            auVar232 = vsubps_avx(_local_458,auVar127);
            auVar147 = vsubps_avx(_local_458,auVar245);
            auVar231._0_4_ = fVar212 * auVar232._0_4_;
            auVar231._4_4_ = fVar213 * auVar232._4_4_;
            auVar231._8_4_ = fVar215 * auVar232._8_4_;
            auVar231._12_4_ = fVar234 * auVar232._12_4_;
            auVar246._0_4_ = fVar212 * auVar147._0_4_;
            auVar246._4_4_ = fVar213 * auVar147._4_4_;
            auVar246._8_4_ = fVar215 * auVar147._8_4_;
            auVar246._12_4_ = fVar234 * auVar147._12_4_;
            auVar128._0_4_ = fVar188 * auVar232._0_4_;
            auVar128._4_4_ = fVar189 * auVar232._4_4_;
            auVar128._8_4_ = fVar190 * auVar232._8_4_;
            auVar128._12_4_ = fVar211 * auVar232._12_4_;
            auVar178._0_4_ = fVar188 * auVar147._0_4_;
            auVar178._4_4_ = fVar189 * auVar147._4_4_;
            auVar178._8_4_ = fVar190 * auVar147._8_4_;
            auVar178._12_4_ = fVar211 * auVar147._12_4_;
            auVar232 = vminps_avx(auVar231,auVar246);
            auVar147 = vminps_avx(auVar128,auVar178);
            auVar232 = vminps_avx(auVar232,auVar147);
            auVar147 = vmaxps_avx(auVar246,auVar231);
            auVar121 = vmaxps_avx(auVar178,auVar128);
            auVar232 = vhaddps_avx(auVar232,auVar232);
            auVar147 = vmaxps_avx(auVar121,auVar147);
            auVar147 = vhaddps_avx(auVar147,auVar147);
            auVar121 = vmovshdup_avx(auVar19);
            auVar179 = ZEXT416((uint)(auVar121._0_4_ + auVar232._0_4_));
            auVar232 = vmaxss_avx(_local_498,auVar179);
            auVar121 = ZEXT416((uint)(auVar121._0_4_ + auVar147._0_4_));
            auVar147 = vminss_avx(auVar121,_local_438);
            auVar339._8_4_ = 0x7fffffff;
            auVar339._0_8_ = 0x7fffffff7fffffff;
            auVar339._12_4_ = 0x7fffffff;
            if (auVar232._0_4_ <= auVar147._0_4_) {
              uVar69 = 0;
              auVar348 = ZEXT864(0) << 0x20;
              if ((fVar162 < fVar163) && (fVar187 < fVar136)) {
                auVar232 = vcmpps_avx(auVar121,_local_438,1);
                auVar147 = vcmpps_avx(_local_498,auVar179,1);
                auVar232 = vandps_avx(auVar147,auVar232);
                uVar69 = auVar232._0_4_;
              }
              if (((uint)uVar71 < 4 && 0.001 <= fVar161) && (uVar69 & 1) == 0) {
                bVar57 = false;
              }
              else {
                lVar72 = 200;
                do {
                  fVar161 = auVar19._0_4_;
                  fVar136 = 1.0 - fVar161;
                  auVar232 = ZEXT416((uint)(fVar136 * fVar136 * fVar136));
                  auVar232 = vshufps_avx(auVar232,auVar232,0);
                  auVar147 = ZEXT416((uint)(fVar161 * 3.0 * fVar136 * fVar136));
                  auVar147 = vshufps_avx(auVar147,auVar147,0);
                  auVar121 = ZEXT416((uint)(fVar136 * fVar161 * fVar161 * 3.0));
                  auVar121 = vshufps_avx(auVar121,auVar121,0);
                  auVar179 = ZEXT416((uint)(fVar161 * fVar161 * fVar161));
                  auVar179 = vshufps_avx(auVar179,auVar179,0);
                  fVar136 = (float)local_3f8._0_4_ * auVar232._0_4_ +
                            (float)local_408._0_4_ * auVar147._0_4_ +
                            (float)local_288._0_4_ * auVar179._0_4_ +
                            (float)local_418._0_4_ * auVar121._0_4_;
                  fVar161 = (float)local_3f8._4_4_ * auVar232._4_4_ +
                            (float)local_408._4_4_ * auVar147._4_4_ +
                            (float)local_288._4_4_ * auVar179._4_4_ +
                            (float)local_418._4_4_ * auVar121._4_4_;
                  auVar129._0_8_ = CONCAT44(fVar161,fVar136);
                  auVar129._8_4_ =
                       fStack_3f0 * auVar232._8_4_ +
                       fStack_400 * auVar147._8_4_ +
                       fStack_280 * auVar179._8_4_ + fStack_410 * auVar121._8_4_;
                  auVar129._12_4_ =
                       fStack_3ec * auVar232._12_4_ +
                       fStack_3fc * auVar147._12_4_ +
                       fStack_27c * auVar179._12_4_ + fStack_40c * auVar121._12_4_;
                  auVar180._8_8_ = auVar129._0_8_;
                  auVar180._0_8_ = auVar129._0_8_;
                  auVar147 = vshufpd_avx(auVar129,auVar129,1);
                  auVar232 = vmovshdup_avx(auVar19);
                  auVar147 = vsubps_avx(auVar147,auVar180);
                  auVar130._0_4_ = auVar232._0_4_ * auVar147._0_4_ + fVar136;
                  auVar130._4_4_ = auVar232._4_4_ * auVar147._4_4_ + fVar161;
                  auVar130._8_4_ = auVar232._8_4_ * auVar147._8_4_ + fVar136;
                  auVar130._12_4_ = auVar232._12_4_ * auVar147._12_4_ + fVar161;
                  auVar232 = vshufps_avx(auVar130,auVar130,0);
                  auVar147 = vshufps_avx(auVar130,auVar130,0x55);
                  auVar181._0_4_ = auVar122._0_4_ * auVar232._0_4_ + auVar18._0_4_ * auVar147._0_4_;
                  auVar181._4_4_ = auVar122._4_4_ * auVar232._4_4_ + auVar18._4_4_ * auVar147._4_4_;
                  auVar181._8_4_ = auVar122._8_4_ * auVar232._8_4_ + auVar18._8_4_ * auVar147._8_4_;
                  auVar181._12_4_ =
                       auVar122._12_4_ * auVar232._12_4_ + auVar18._12_4_ * auVar147._12_4_;
                  auVar19 = vsubps_avx(auVar19,auVar181);
                  auVar232 = vandps_avx(auVar339,auVar130);
                  auVar147 = vshufps_avx(auVar232,auVar232,0xf5);
                  auVar232 = vmaxss_avx(auVar147,auVar232);
                  if (auVar232._0_4_ < fVar79) {
                    fVar136 = auVar19._0_4_;
                    if ((0.0 <= fVar136) && (fVar136 <= 1.0)) {
                      auVar122 = vmovshdup_avx(auVar19);
                      fVar161 = auVar122._0_4_;
                      if ((0.0 <= fVar161) && (fVar161 <= 1.0)) {
                        auVar122 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                 ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                 0x1c);
                        auVar151 = vinsertps_avx(auVar122,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                        aVar10 = (ray->org).field_0;
                        auVar122 = vsubps_avx(_local_318,(undefined1  [16])aVar10);
                        auVar122 = vdpps_avx(auVar122,auVar151,0x7f);
                        auVar18 = vsubps_avx(_local_328,(undefined1  [16])aVar10);
                        auVar18 = vdpps_avx(auVar18,auVar151,0x7f);
                        auVar232 = vsubps_avx(_local_338,(undefined1  [16])aVar10);
                        auVar232 = vdpps_avx(auVar232,auVar151,0x7f);
                        auVar147 = vsubps_avx(_local_348,(undefined1  [16])aVar10);
                        auVar147 = vdpps_avx(auVar147,auVar151,0x7f);
                        auVar121 = vsubps_avx(_local_358,(undefined1  [16])aVar10);
                        auVar121 = vdpps_avx(auVar121,auVar151,0x7f);
                        auVar179 = vsubps_avx(_local_368,(undefined1  [16])aVar10);
                        auVar179 = vdpps_avx(auVar179,auVar151,0x7f);
                        auVar65._4_4_ = fStack_374;
                        auVar65._0_4_ = local_378;
                        auVar65._8_4_ = fStack_370;
                        auVar65._12_4_ = fStack_36c;
                        auVar96 = vsubps_avx(auVar65,(undefined1  [16])aVar10);
                        auVar96 = vdpps_avx(auVar96,auVar151,0x7f);
                        auVar62._4_4_ = fStack_384;
                        auVar62._0_4_ = local_388;
                        auVar62._8_4_ = fStack_380;
                        auVar62._12_4_ = fStack_37c;
                        auVar20 = vsubps_avx(auVar62,(undefined1  [16])aVar10);
                        auVar151 = vdpps_avx(auVar20,auVar151,0x7f);
                        fVar190 = 1.0 - fVar161;
                        fVar211 = 1.0 - fVar136;
                        fVar163 = auVar19._4_4_;
                        fVar187 = auVar19._8_4_;
                        fVar188 = auVar19._12_4_;
                        fVar189 = fVar211 * fVar136 * fVar136 * 3.0;
                        auVar233._0_4_ = fVar136 * fVar136 * fVar136;
                        auVar233._4_4_ = fVar163 * fVar163 * fVar163;
                        auVar233._8_4_ = fVar187 * fVar187 * fVar187;
                        auVar233._12_4_ = fVar188 * fVar188 * fVar188;
                        fVar163 = fVar136 * 3.0 * fVar211 * fVar211;
                        fVar187 = fVar211 * fVar211 * fVar211;
                        fVar136 = (fVar190 * auVar122._0_4_ + auVar121._0_4_ * fVar161) * fVar187 +
                                  fVar163 * (auVar179._0_4_ * fVar161 + fVar190 * auVar18._0_4_) +
                                  fVar189 * (auVar96._0_4_ * fVar161 + fVar190 * auVar232._0_4_) +
                                  auVar233._0_4_ *
                                  (fVar190 * auVar147._0_4_ + fVar161 * auVar151._0_4_);
                        if (((ray->org).field_0.m128[3] <= fVar136) &&
                           (fVar161 = ray->tfar, fVar136 <= fVar161)) {
                          local_438 = auVar77;
                          pGVar12 = (context->scene->geometries).items[uVar70].ptr;
                          auVar122 = ZEXT416((uint)fVar162);
                          if ((pGVar12->mask & ray->mask) == 0) {
                            bVar67 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar67 = true,
                                  pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar122 = vshufps_avx(auVar19,auVar19,0x55);
                            auVar281._8_4_ = 0x3f800000;
                            auVar281._0_8_ = &DAT_3f8000003f800000;
                            auVar281._12_4_ = 0x3f800000;
                            auVar171 = vsubps_avx(auVar281,auVar122);
                            fVar162 = auVar122._0_4_;
                            fVar188 = auVar122._4_4_;
                            fVar190 = auVar122._8_4_;
                            fVar212 = auVar122._12_4_;
                            fVar213 = auVar171._0_4_;
                            fVar215 = auVar171._4_4_;
                            fVar234 = auVar171._8_4_;
                            fVar235 = auVar171._12_4_;
                            auVar294._0_4_ =
                                 fVar162 * (float)local_358._0_4_ + fVar213 * (float)local_318._0_4_
                            ;
                            auVar294._4_4_ =
                                 fVar188 * (float)local_358._4_4_ + fVar215 * (float)local_318._4_4_
                            ;
                            auVar294._8_4_ = fVar190 * fStack_350 + fVar234 * fStack_310;
                            auVar294._12_4_ = fVar212 * fStack_34c + fVar235 * fStack_30c;
                            auVar305._0_4_ =
                                 fVar162 * (float)local_368._0_4_ + fVar213 * (float)local_328._0_4_
                            ;
                            auVar305._4_4_ =
                                 fVar188 * (float)local_368._4_4_ + fVar215 * (float)local_328._4_4_
                            ;
                            auVar305._8_4_ = fVar190 * fStack_360 + fVar234 * fStack_320;
                            auVar305._12_4_ = fVar212 * fStack_35c + fVar235 * fStack_31c;
                            auVar314._0_4_ = fVar162 * local_378 + fVar213 * (float)local_338._0_4_;
                            auVar314._4_4_ = fVar188 * fStack_374 + fVar215 * (float)local_338._4_4_
                            ;
                            auVar314._8_4_ = fVar190 * fStack_370 + fVar234 * fStack_330;
                            auVar314._12_4_ = fVar212 * fStack_36c + fVar235 * fStack_32c;
                            auVar261._0_4_ = fVar213 * (float)local_348._0_4_ + fVar162 * local_388;
                            auVar261._4_4_ = fVar215 * (float)local_348._4_4_ + fVar188 * fStack_384
                            ;
                            auVar261._8_4_ = fVar234 * fStack_340 + fVar190 * fStack_380;
                            auVar261._12_4_ = fVar235 * fStack_33c + fVar212 * fStack_37c;
                            auVar232 = vsubps_avx(auVar305,auVar294);
                            auVar147 = vsubps_avx(auVar314,auVar305);
                            auVar121 = vsubps_avx(auVar261,auVar314);
                            auVar122 = vshufps_avx(auVar19,auVar19,0);
                            fVar212 = auVar122._0_4_;
                            fVar213 = auVar122._4_4_;
                            fVar215 = auVar122._8_4_;
                            fVar234 = auVar122._12_4_;
                            auVar122 = vshufps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),0);
                            fVar162 = auVar122._0_4_;
                            fVar188 = auVar122._4_4_;
                            fVar190 = auVar122._8_4_;
                            fVar211 = auVar122._12_4_;
                            auVar122 = vshufps_avx(auVar233,auVar233,0);
                            auVar171 = vshufps_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar189),0);
                            auVar18 = vshufps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),0);
                            auVar207._0_4_ =
                                 ((auVar232._0_4_ * fVar162 + fVar212 * auVar147._0_4_) * fVar162 +
                                 fVar212 * (auVar147._0_4_ * fVar162 + fVar212 * auVar121._0_4_)) *
                                 3.0;
                            auVar207._4_4_ =
                                 ((auVar232._4_4_ * fVar188 + fVar213 * auVar147._4_4_) * fVar188 +
                                 fVar213 * (auVar147._4_4_ * fVar188 + fVar213 * auVar121._4_4_)) *
                                 3.0;
                            auVar207._8_4_ =
                                 ((auVar232._8_4_ * fVar190 + fVar215 * auVar147._8_4_) * fVar190 +
                                 fVar215 * (auVar147._8_4_ * fVar190 + fVar215 * auVar121._8_4_)) *
                                 3.0;
                            auVar207._12_4_ =
                                 ((auVar232._12_4_ * fVar211 + fVar234 * auVar147._12_4_) * fVar211
                                 + fVar234 * (auVar147._12_4_ * fVar211 + fVar234 * auVar121._12_4_)
                                 ) * 3.0;
                            auVar232 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
                            auVar156._0_4_ =
                                 auVar232._0_4_ * (float)local_1f8._0_4_ +
                                 auVar18._0_4_ * (float)local_208._0_4_ +
                                 auVar122._0_4_ * (float)local_228._0_4_ +
                                 auVar171._0_4_ * (float)local_218._0_4_;
                            auVar156._4_4_ =
                                 auVar232._4_4_ * (float)local_1f8._4_4_ +
                                 auVar18._4_4_ * (float)local_208._4_4_ +
                                 auVar122._4_4_ * (float)local_228._4_4_ +
                                 auVar171._4_4_ * (float)local_218._4_4_;
                            auVar156._8_4_ =
                                 auVar232._8_4_ * fStack_1f0 +
                                 auVar18._8_4_ * fStack_200 +
                                 auVar122._8_4_ * fStack_220 + auVar171._8_4_ * fStack_210;
                            auVar156._12_4_ =
                                 auVar232._12_4_ * fStack_1ec +
                                 auVar18._12_4_ * fStack_1fc +
                                 auVar122._12_4_ * fStack_21c + auVar171._12_4_ * fStack_20c;
                            auVar122 = vshufps_avx(auVar207,auVar207,0xc9);
                            auVar182._0_4_ = auVar156._0_4_ * auVar122._0_4_;
                            auVar182._4_4_ = auVar156._4_4_ * auVar122._4_4_;
                            auVar182._8_4_ = auVar156._8_4_ * auVar122._8_4_;
                            auVar182._12_4_ = auVar156._12_4_ * auVar122._12_4_;
                            auVar122 = vshufps_avx(auVar156,auVar156,0xc9);
                            auVar157._0_4_ = auVar207._0_4_ * auVar122._0_4_;
                            auVar157._4_4_ = auVar207._4_4_ * auVar122._4_4_;
                            auVar157._8_4_ = auVar207._8_4_ * auVar122._8_4_;
                            auVar157._12_4_ = auVar207._12_4_ * auVar122._12_4_;
                            auVar171 = vsubps_avx(auVar157,auVar182);
                            auVar122 = vshufps_avx(auVar171,auVar171,0xe9);
                            local_258 = vmovlps_avx(auVar122);
                            local_250 = auVar171._0_4_;
                            local_24c = vmovlps_avx(auVar19);
                            local_244 = (int)local_2d0;
                            local_240 = uVar70;
                            local_23c = context->user->instID[0];
                            local_238 = context->user->instPrimID[0];
                            ray->tfar = fVar136;
                            local_45c = -1;
                            local_2b8.valid = &local_45c;
                            local_2b8.geometryUserPtr = pGVar12->userPtr;
                            local_2b8.context = context->user;
                            local_2b8.hit = (RTCHitN *)&local_258;
                            local_2b8.N = 1;
                            stack0xfffffffffffffc5c = auVar24._4_28_;
                            local_3a8._0_4_ = fVar161;
                            local_2b8.ray = (RTCRayN *)ray;
                            if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ffb90d:
                              p_Var17 = context->args->filter;
                              if (p_Var17 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var17)(&local_2b8);
                                  auVar348 = ZEXT1664(ZEXT816(0) << 0x40);
                                  fVar161 = (float)local_3a8._0_4_;
                                }
                                if (*local_2b8.valid == 0) {
                                  bVar67 = false;
                                  goto LAB_00ffb9f0;
                                }
                              }
                              bVar67 = true;
                            }
                            else {
                              (*pGVar12->occlusionFilterN)(&local_2b8);
                              auVar348 = ZEXT1664(ZEXT816(0) << 0x40);
                              fVar161 = (float)local_3a8._0_4_;
                              if (*local_2b8.valid != 0) goto LAB_00ffb90d;
                              bVar67 = false;
                            }
LAB_00ffb9f0:
                            auVar122 = _local_3e8;
                            if (!bVar67) {
                              ray->tfar = fVar161;
                            }
                          }
                          _local_3e8 = auVar122;
                          bVar66 = (bool)(bVar66 | bVar67);
                          pre = local_2c8;
                          auVar77 = local_438;
                          auVar171 = _local_3e8;
                        }
                      }
                    }
                    break;
                  }
                  lVar72 = lVar72 + -1;
                } while (lVar72 != 0);
              }
              goto LAB_00ffb68d;
            }
          }
          goto LAB_00ffb9c0;
        }
      }
LAB_00ffb68d:
      _local_3e8 = auVar171;
      auVar122 = _local_3e8;
    } while (bVar57);
    _local_3e8 = auVar122;
    local_1d8 = vinsertps_avx(_local_3e8,ZEXT416((uint)local_3c8._0_4_),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }